

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  byte bVar35;
  uint uVar36;
  ulong uVar37;
  long lVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined8 in_R10;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float t1;
  undefined4 uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float fVar134;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vfloat4 b0;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vfloat4 b0_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vfloat4 a0_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar207;
  float fVar208;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar220;
  float fVar221;
  vfloat4 a0_1;
  undefined1 auVar210 [16];
  float fVar222;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar228;
  float fVar229;
  vfloat4 a0;
  undefined1 auVar224 [16];
  float fVar230;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_460;
  uint auStack_430 [4];
  undefined1 local_420 [32];
  undefined1 local_3f0 [8];
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar38;
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar234 [32];
  
  uVar37 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar37 * 0x19 + 0x12);
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar56 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar49 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar51 = vsubps_avx(auVar48,*(undefined1 (*) [16])(prim + uVar37 * 0x19 + 6));
  fVar126 = fVar1 * auVar51._0_4_;
  fVar107 = fVar1 * auVar49._0_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar37 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar48);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar37 * 5 + 6);
  auVar78 = vpmovsxbd_avx2(auVar56);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar37 * 6 + 6);
  auVar79 = vpmovsxbd_avx2(auVar55);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar37 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar54);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar37 * 0xc + 6);
  auVar91 = vpmovsxbd_avx2(auVar57);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar37 * 0xd + 6);
  auVar80 = vpmovsxbd_avx2(auVar4);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar37 * 0x12 + 6);
  auVar82 = vpmovsxbd_avx2(auVar53);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar37 * 0x13 + 6);
  auVar85 = vpmovsxbd_avx2(auVar52);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar85);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar37 * 0x14 + 6);
  auVar76 = vpmovsxbd_avx2(auVar5);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar138._4_4_ = fVar107;
  auVar138._0_4_ = fVar107;
  auVar138._8_4_ = fVar107;
  auVar138._12_4_ = fVar107;
  auVar138._16_4_ = fVar107;
  auVar138._20_4_ = fVar107;
  auVar138._24_4_ = fVar107;
  auVar138._28_4_ = fVar107;
  auVar240._8_4_ = 1;
  auVar240._0_8_ = 0x100000001;
  auVar240._12_4_ = 1;
  auVar240._16_4_ = 1;
  auVar240._20_4_ = 1;
  auVar240._24_4_ = 1;
  auVar240._28_4_ = 1;
  auVar86 = ZEXT1632(CONCAT412(fVar1 * auVar49._12_4_,
                               CONCAT48(fVar1 * auVar49._8_4_,
                                        CONCAT44(fVar1 * auVar49._4_4_,fVar107))));
  auVar77 = vpermps_avx2(auVar240,auVar86);
  auVar74 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar248 = ZEXT3264(auVar74);
  auVar75 = vpermps_avx512vl(auVar74,auVar86);
  fVar107 = auVar75._0_4_;
  fVar198 = auVar75._4_4_;
  auVar86._4_4_ = fVar198 * auVar79._4_4_;
  auVar86._0_4_ = fVar107 * auVar79._0_4_;
  fVar207 = auVar75._8_4_;
  auVar86._8_4_ = fVar207 * auVar79._8_4_;
  fVar208 = auVar75._12_4_;
  auVar86._12_4_ = fVar208 * auVar79._12_4_;
  fVar112 = auVar75._16_4_;
  auVar86._16_4_ = fVar112 * auVar79._16_4_;
  fVar113 = auVar75._20_4_;
  auVar86._20_4_ = fVar113 * auVar79._20_4_;
  fVar114 = auVar75._24_4_;
  auVar86._24_4_ = fVar114 * auVar79._24_4_;
  auVar86._28_4_ = auVar85._28_4_;
  auVar85._4_4_ = auVar80._4_4_ * fVar198;
  auVar85._0_4_ = auVar80._0_4_ * fVar107;
  auVar85._8_4_ = auVar80._8_4_ * fVar207;
  auVar85._12_4_ = auVar80._12_4_ * fVar208;
  auVar85._16_4_ = auVar80._16_4_ * fVar112;
  auVar85._20_4_ = auVar80._20_4_ * fVar113;
  auVar85._24_4_ = auVar80._24_4_ * fVar114;
  auVar85._28_4_ = auVar76._28_4_;
  auVar76._4_4_ = auVar84._4_4_ * fVar198;
  auVar76._0_4_ = auVar84._0_4_ * fVar107;
  auVar76._8_4_ = auVar84._8_4_ * fVar207;
  auVar76._12_4_ = auVar84._12_4_ * fVar208;
  auVar76._16_4_ = auVar84._16_4_ * fVar112;
  auVar76._20_4_ = auVar84._20_4_ * fVar113;
  auVar76._24_4_ = auVar84._24_4_ * fVar114;
  auVar76._28_4_ = auVar75._28_4_;
  auVar48 = vfmadd231ps_fma(auVar86,auVar77,auVar78);
  auVar56 = vfmadd231ps_fma(auVar85,auVar77,auVar91);
  auVar55 = vfmadd231ps_fma(auVar76,auVar83,auVar77);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar138,auVar81);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar138,auVar90);
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar82,auVar138);
  auVar150._4_4_ = fVar126;
  auVar150._0_4_ = fVar126;
  auVar150._8_4_ = fVar126;
  auVar150._12_4_ = fVar126;
  auVar150._16_4_ = fVar126;
  auVar150._20_4_ = fVar126;
  auVar150._24_4_ = fVar126;
  auVar150._28_4_ = fVar126;
  auVar76 = ZEXT1632(CONCAT412(fVar1 * auVar51._12_4_,
                               CONCAT48(fVar1 * auVar51._8_4_,
                                        CONCAT44(fVar1 * auVar51._4_4_,fVar126))));
  auVar85 = vpermps_avx2(auVar240,auVar76);
  auVar76 = vpermps_avx512vl(auVar74,auVar76);
  auVar77 = vmulps_avx512vl(auVar76,auVar79);
  auVar88._0_4_ = auVar76._0_4_ * auVar80._0_4_;
  auVar88._4_4_ = auVar76._4_4_ * auVar80._4_4_;
  auVar88._8_4_ = auVar76._8_4_ * auVar80._8_4_;
  auVar88._12_4_ = auVar76._12_4_ * auVar80._12_4_;
  auVar88._16_4_ = auVar76._16_4_ * auVar80._16_4_;
  auVar88._20_4_ = auVar76._20_4_ * auVar80._20_4_;
  auVar88._24_4_ = auVar76._24_4_ * auVar80._24_4_;
  auVar88._28_4_ = 0;
  auVar80._4_4_ = auVar76._4_4_ * auVar84._4_4_;
  auVar80._0_4_ = auVar76._0_4_ * auVar84._0_4_;
  auVar80._8_4_ = auVar76._8_4_ * auVar84._8_4_;
  auVar80._12_4_ = auVar76._12_4_ * auVar84._12_4_;
  auVar80._16_4_ = auVar76._16_4_ * auVar84._16_4_;
  auVar80._20_4_ = auVar76._20_4_ * auVar84._20_4_;
  auVar80._24_4_ = auVar76._24_4_ * auVar84._24_4_;
  auVar80._28_4_ = auVar79._28_4_;
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar85,auVar78);
  auVar54 = vfmadd231ps_fma(auVar88,auVar85,auVar91);
  auVar57 = vfmadd231ps_fma(auVar80,auVar85,auVar83);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar150,auVar81);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar150,auVar90);
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar150,auVar82);
  auVar92._8_4_ = 0x7fffffff;
  auVar92._0_8_ = 0x7fffffff7fffffff;
  auVar92._12_4_ = 0x7fffffff;
  auVar92._16_4_ = 0x7fffffff;
  auVar92._20_4_ = 0x7fffffff;
  auVar92._24_4_ = 0x7fffffff;
  auVar92._28_4_ = 0x7fffffff;
  auVar81 = vandps_avx(ZEXT1632(auVar48),auVar92);
  auVar94._8_4_ = 0x219392ef;
  auVar94._0_8_ = 0x219392ef219392ef;
  auVar94._12_4_ = 0x219392ef;
  auVar94._16_4_ = 0x219392ef;
  auVar94._20_4_ = 0x219392ef;
  auVar94._24_4_ = 0x219392ef;
  auVar94._28_4_ = 0x219392ef;
  uVar42 = vcmpps_avx512vl(auVar81,auVar94,1);
  bVar46 = (bool)((byte)uVar42 & 1);
  auVar77._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._0_4_;
  bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._4_4_;
  bVar46 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._8_4_;
  bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar48._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar42 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar56),auVar92);
  uVar42 = vcmpps_avx512vl(auVar81,auVar94,1);
  bVar46 = (bool)((byte)uVar42 & 1);
  auVar74._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar56._0_4_;
  bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar56._4_4_;
  bVar46 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar56._8_4_;
  bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar56._12_4_;
  auVar74._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * 0x219392ef;
  auVar74._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * 0x219392ef;
  auVar74._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * 0x219392ef;
  auVar74._28_4_ = (uint)(byte)(uVar42 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar55),auVar92);
  uVar42 = vcmpps_avx512vl(auVar81,auVar94,1);
  bVar46 = (bool)((byte)uVar42 & 1);
  auVar81._0_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar55._0_4_;
  bVar46 = (bool)((byte)(uVar42 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar55._4_4_;
  bVar46 = (bool)((byte)(uVar42 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar55._8_4_;
  bVar46 = (bool)((byte)(uVar42 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar46 * 0x219392ef | (uint)!bVar46 * auVar55._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar42 >> 7) * 0x219392ef;
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar93._8_4_ = 0x3f800000;
  auVar93._0_8_ = 0x3f8000003f800000;
  auVar93._12_4_ = 0x3f800000;
  auVar93._16_4_ = 0x3f800000;
  auVar93._20_4_ = 0x3f800000;
  auVar93._24_4_ = 0x3f800000;
  auVar93._28_4_ = 0x3f800000;
  auVar48 = vfnmadd213ps_fma(auVar77,auVar79,auVar93);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar74);
  auVar56 = vfnmadd213ps_fma(auVar74,auVar79,auVar93);
  auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar81);
  auVar55 = vfnmadd213ps_fma(auVar81,auVar79,auVar93);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 7 + 6));
  auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar79,auVar79);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vsubps_avx512vl(auVar81,auVar78);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 9 + 6));
  auVar82._4_4_ = auVar48._4_4_ * auVar79._4_4_;
  auVar82._0_4_ = auVar48._0_4_ * auVar79._0_4_;
  auVar82._8_4_ = auVar48._8_4_ * auVar79._8_4_;
  auVar82._12_4_ = auVar48._12_4_ * auVar79._12_4_;
  auVar82._16_4_ = auVar79._16_4_ * 0.0;
  auVar82._20_4_ = auVar79._20_4_ * 0.0;
  auVar82._24_4_ = auVar79._24_4_ * 0.0;
  auVar82._28_4_ = auVar79._28_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar78 = vsubps_avx512vl(auVar81,auVar78);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0xe + 6));
  auVar89._0_4_ = auVar48._0_4_ * auVar78._0_4_;
  auVar89._4_4_ = auVar48._4_4_ * auVar78._4_4_;
  auVar89._8_4_ = auVar48._8_4_ * auVar78._8_4_;
  auVar89._12_4_ = auVar48._12_4_ * auVar78._12_4_;
  auVar89._16_4_ = auVar78._16_4_ * 0.0;
  auVar89._20_4_ = auVar78._20_4_ * 0.0;
  auVar89._24_4_ = auVar78._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar54));
  auVar83._4_4_ = auVar56._4_4_ * auVar81._4_4_;
  auVar83._0_4_ = auVar56._0_4_ * auVar81._0_4_;
  auVar83._8_4_ = auVar56._8_4_ * auVar81._8_4_;
  auVar83._12_4_ = auVar56._12_4_ * auVar81._12_4_;
  auVar83._16_4_ = auVar81._16_4_ * 0.0;
  auVar83._20_4_ = auVar81._20_4_ * 0.0;
  auVar83._24_4_ = auVar81._24_4_ * 0.0;
  auVar83._28_4_ = auVar81._28_4_;
  auVar80 = vpbroadcastd_avx512vl();
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar54));
  auVar87._0_4_ = auVar56._0_4_ * auVar81._0_4_;
  auVar87._4_4_ = auVar56._4_4_ * auVar81._4_4_;
  auVar87._8_4_ = auVar56._8_4_ * auVar81._8_4_;
  auVar87._12_4_ = auVar56._12_4_ * auVar81._12_4_;
  auVar87._16_4_ = auVar81._16_4_ * 0.0;
  auVar87._20_4_ = auVar81._20_4_ * 0.0;
  auVar87._24_4_ = auVar81._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0x15 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar57));
  auVar84._4_4_ = auVar81._4_4_ * auVar55._4_4_;
  auVar84._0_4_ = auVar81._0_4_ * auVar55._0_4_;
  auVar84._8_4_ = auVar81._8_4_ * auVar55._8_4_;
  auVar84._12_4_ = auVar81._12_4_ * auVar55._12_4_;
  auVar84._16_4_ = auVar81._16_4_ * 0.0;
  auVar84._20_4_ = auVar81._20_4_ * 0.0;
  auVar84._24_4_ = auVar81._24_4_ * 0.0;
  auVar84._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar37 * 0x17 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar57));
  auVar75._0_4_ = auVar55._0_4_ * auVar81._0_4_;
  auVar75._4_4_ = auVar55._4_4_ * auVar81._4_4_;
  auVar75._8_4_ = auVar55._8_4_ * auVar81._8_4_;
  auVar75._12_4_ = auVar55._12_4_ * auVar81._12_4_;
  auVar75._16_4_ = auVar81._16_4_ * 0.0;
  auVar75._20_4_ = auVar81._20_4_ * 0.0;
  auVar75._24_4_ = auVar81._24_4_ * 0.0;
  auVar75._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar82,auVar89);
  auVar78 = vpminsd_avx2(auVar83,auVar87);
  auVar81 = vmaxps_avx(auVar81,auVar78);
  auVar78 = vpminsd_avx2(auVar84,auVar75);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar79._4_4_ = uVar115;
  auVar79._0_4_ = uVar115;
  auVar79._8_4_ = uVar115;
  auVar79._12_4_ = uVar115;
  auVar79._16_4_ = uVar115;
  auVar79._20_4_ = uVar115;
  auVar79._24_4_ = uVar115;
  auVar79._28_4_ = uVar115;
  auVar78 = vmaxps_avx512vl(auVar78,auVar79);
  auVar81 = vmaxps_avx(auVar81,auVar78);
  auVar78._8_4_ = 0x3f7ffffa;
  auVar78._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar78._12_4_ = 0x3f7ffffa;
  auVar78._16_4_ = 0x3f7ffffa;
  auVar78._20_4_ = 0x3f7ffffa;
  auVar78._24_4_ = 0x3f7ffffa;
  auVar78._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar81,auVar78);
  auVar81 = vpmaxsd_avx2(auVar82,auVar89);
  auVar78 = vpmaxsd_avx2(auVar83,auVar87);
  auVar81 = vminps_avx(auVar81,auVar78);
  auVar78 = vpmaxsd_avx2(auVar84,auVar75);
  uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar90._4_4_ = uVar115;
  auVar90._0_4_ = uVar115;
  auVar90._8_4_ = uVar115;
  auVar90._12_4_ = uVar115;
  auVar90._16_4_ = uVar115;
  auVar90._20_4_ = uVar115;
  auVar90._24_4_ = uVar115;
  auVar90._28_4_ = uVar115;
  auVar78 = vminps_avx512vl(auVar78,auVar90);
  auVar81 = vminps_avx(auVar81,auVar78);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar91);
  uVar16 = vcmpps_avx512vl(local_1c0,auVar81,2);
  uVar17 = vpcmpgtd_avx512vl(auVar80,_DAT_01fb4ba0);
  uVar42 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar17));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar241 = ZEXT1664(auVar48);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar242 = ZEXT1664(auVar48);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar243 = ZEXT1664(auVar48);
  auVar250 = ZEXT464(0x3f800000);
  auVar48 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar249 = ZEXT1664(auVar48);
LAB_019c5edc:
  if (uVar42 == 0) {
    return;
  }
  lVar39 = 0;
  for (uVar37 = uVar42; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    lVar39 = lVar39 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar39 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  uVar37 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar48 = *(undefined1 (*) [16])(_Var12 + uVar37 * (long)pvVar11);
  auVar56 = *(undefined1 (*) [16])(_Var12 + (uVar37 + 1) * (long)pvVar11);
  auVar55 = *(undefined1 (*) [16])(_Var12 + (uVar37 + 2) * (long)pvVar11);
  auVar54 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar37 + 3));
  lVar39 = *(long *)&pGVar9[1].time_range.upper;
  auVar57 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * uVar37);
  auVar4 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * (uVar37 + 1));
  auVar53 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * (uVar37 + 2));
  uVar42 = uVar42 - 1 & uVar42;
  auVar52 = *(undefined1 (*) [16])(lVar39 + (long)p_Var10 * (uVar37 + 3));
  if (uVar42 != 0) {
    uVar43 = uVar42 - 1 & uVar42;
    for (uVar37 = uVar42; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
    }
    if (uVar43 != 0) {
      for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar116 = ZEXT816(0) << 0x40;
  auVar51._0_4_ = auVar52._0_4_ * 0.0;
  auVar51._4_4_ = auVar52._4_4_ * 0.0;
  auVar51._8_4_ = auVar52._8_4_ * 0.0;
  auVar51._12_4_ = auVar52._12_4_ * 0.0;
  auVar51 = vfmadd231ps_fma(auVar51,auVar53,auVar116);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar51);
  auVar120._0_4_ = auVar57._0_4_ + auVar49._0_4_;
  auVar120._4_4_ = auVar57._4_4_ + auVar49._4_4_;
  auVar120._8_4_ = auVar57._8_4_ + auVar49._8_4_;
  auVar120._12_4_ = auVar57._12_4_ + auVar49._12_4_;
  auVar117 = auVar241._0_16_;
  auVar49 = vfmadd231ps_avx512vl(auVar51,auVar4,auVar117);
  auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar57,auVar117);
  auVar210._0_4_ = auVar54._0_4_ * 0.0;
  auVar210._4_4_ = auVar54._4_4_ * 0.0;
  auVar210._8_4_ = auVar54._8_4_ * 0.0;
  auVar210._12_4_ = auVar54._12_4_ * 0.0;
  auVar51 = vfmadd231ps_fma(auVar210,auVar55,auVar116);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar56,auVar51);
  auVar224._0_4_ = auVar48._0_4_ + auVar49._0_4_;
  auVar224._4_4_ = auVar48._4_4_ + auVar49._4_4_;
  auVar224._8_4_ = auVar48._8_4_ + auVar49._8_4_;
  auVar224._12_4_ = auVar48._12_4_ + auVar49._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar51,auVar56,auVar117);
  auVar51 = vfnmadd231ps_avx512vl(auVar49,auVar48,auVar117);
  auVar49 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar53,auVar52);
  auVar49 = vfmadd231ps_fma(auVar49,auVar4,auVar116);
  auVar49 = vfmadd231ps_fma(auVar49,auVar57,auVar116);
  auVar52 = vmulps_avx512vl(auVar52,auVar117);
  auVar53 = vfnmadd231ps_avx512vl(auVar52,auVar117,auVar53);
  auVar4 = vfmadd231ps_fma(auVar53,auVar116,auVar4);
  auVar53 = vfnmadd231ps_fma(auVar4,auVar116,auVar57);
  auVar57 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar55,auVar54);
  auVar57 = vfmadd231ps_fma(auVar57,auVar56,auVar116);
  auVar57 = vfmadd231ps_fma(auVar57,auVar48,auVar116);
  auVar54 = vmulps_avx512vl(auVar54,auVar117);
  auVar55 = vfnmadd231ps_avx512vl(auVar54,auVar117,auVar55);
  auVar56 = vfmadd231ps_fma(auVar55,auVar116,auVar56);
  auVar4 = vfnmadd231ps_fma(auVar56,auVar116,auVar48);
  auVar48 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar56 = vshufps_avx(auVar224,auVar224,0xc9);
  fVar112 = auVar50._0_4_;
  auVar67._0_4_ = fVar112 * auVar56._0_4_;
  fVar113 = auVar50._4_4_;
  auVar67._4_4_ = fVar113 * auVar56._4_4_;
  fVar114 = auVar50._8_4_;
  auVar67._8_4_ = fVar114 * auVar56._8_4_;
  fVar126 = auVar50._12_4_;
  auVar67._12_4_ = fVar126 * auVar56._12_4_;
  auVar56 = vfmsub231ps_fma(auVar67,auVar48,auVar224);
  auVar55 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar51,auVar51,0xc9);
  auVar153._0_4_ = fVar112 * auVar56._0_4_;
  auVar153._4_4_ = fVar113 * auVar56._4_4_;
  auVar153._8_4_ = fVar114 * auVar56._8_4_;
  auVar153._12_4_ = fVar126 * auVar56._12_4_;
  auVar48 = vfmsub231ps_fma(auVar153,auVar48,auVar51);
  auVar54 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar56 = vshufps_avx(auVar57,auVar57,0xc9);
  fVar134 = auVar53._0_4_;
  auVar68._0_4_ = fVar134 * auVar56._0_4_;
  fVar141 = auVar53._4_4_;
  auVar68._4_4_ = fVar141 * auVar56._4_4_;
  fVar142 = auVar53._8_4_;
  auVar68._8_4_ = fVar142 * auVar56._8_4_;
  fVar143 = auVar53._12_4_;
  auVar68._12_4_ = fVar143 * auVar56._12_4_;
  auVar56 = vfmsub231ps_fma(auVar68,auVar48,auVar57);
  auVar57 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar56 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar180._0_4_ = auVar56._0_4_ * fVar134;
  auVar180._4_4_ = auVar56._4_4_ * fVar141;
  auVar180._8_4_ = auVar56._8_4_ * fVar142;
  auVar180._12_4_ = auVar56._12_4_ * fVar143;
  auVar56 = vfmsub231ps_fma(auVar180,auVar48,auVar4);
  auVar48 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar4 = vshufps_avx(auVar56,auVar56,0xc9);
  fVar107 = auVar48._0_4_;
  auVar181._4_12_ = ZEXT812(0) << 0x20;
  auVar181._0_4_ = fVar107;
  auVar56 = vrsqrt14ss_avx512f(auVar116,auVar181);
  auVar52 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar48,ZEXT416(0x3f000000));
  fVar198 = auVar56._0_4_;
  auVar56 = vdpps_avx(auVar55,auVar54,0x7f);
  fVar207 = auVar52._0_4_ - auVar51._0_4_ * fVar198 * fVar198 * fVar198;
  fVar209 = fVar207 * auVar55._0_4_;
  fVar220 = fVar207 * auVar55._4_4_;
  fVar221 = fVar207 * auVar55._8_4_;
  fVar222 = fVar207 * auVar55._12_4_;
  auVar191._0_4_ = auVar54._0_4_ * fVar107;
  auVar191._4_4_ = auVar54._4_4_ * fVar107;
  auVar191._8_4_ = auVar54._8_4_ * fVar107;
  auVar191._12_4_ = auVar54._12_4_ * fVar107;
  fVar107 = auVar56._0_4_;
  auVar160._0_4_ = fVar107 * auVar55._0_4_;
  auVar160._4_4_ = fVar107 * auVar55._4_4_;
  auVar160._8_4_ = fVar107 * auVar55._8_4_;
  auVar160._12_4_ = fVar107 * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar191,auVar160);
  auVar56 = vrcp14ss_avx512f(auVar116,auVar181);
  auVar48 = vfnmadd213ss_avx512f(auVar48,auVar56,ZEXT416(0x40000000));
  fVar107 = auVar56._0_4_ * auVar48._0_4_;
  auVar48 = vdpps_avx(auVar57,auVar57,0x7f);
  fVar198 = auVar48._0_4_;
  auVar182._4_12_ = ZEXT812(0) << 0x20;
  auVar182._0_4_ = fVar198;
  auVar56 = vrsqrt14ss_avx512f(auVar116,auVar182);
  auVar54 = vmulss_avx512f(auVar56,ZEXT416(0x3fc00000));
  auVar52 = vmulss_avx512f(auVar48,ZEXT416(0x3f000000));
  fVar208 = auVar56._0_4_;
  fVar208 = auVar54._0_4_ - auVar52._0_4_ * fVar208 * fVar208 * fVar208;
  auVar56 = vdpps_avx(auVar57,auVar4,0x7f);
  fVar223 = fVar208 * auVar57._0_4_;
  fVar228 = fVar208 * auVar57._4_4_;
  fVar229 = fVar208 * auVar57._8_4_;
  fVar230 = fVar208 * auVar57._12_4_;
  auVar62._0_4_ = fVar198 * auVar4._0_4_;
  auVar62._4_4_ = fVar198 * auVar4._4_4_;
  auVar62._8_4_ = fVar198 * auVar4._8_4_;
  auVar62._12_4_ = fVar198 * auVar4._12_4_;
  fVar198 = auVar56._0_4_;
  auVar66._0_4_ = fVar198 * auVar57._0_4_;
  auVar66._4_4_ = fVar198 * auVar57._4_4_;
  auVar66._8_4_ = fVar198 * auVar57._8_4_;
  auVar66._12_4_ = fVar198 * auVar57._12_4_;
  auVar54 = vsubps_avx(auVar62,auVar66);
  auVar56 = vrcp14ss_avx512f(auVar116,auVar182);
  auVar48 = vfnmadd213ss_avx512f(auVar48,auVar56,ZEXT416(0x40000000));
  fVar198 = auVar48._0_4_ * auVar56._0_4_;
  auVar48 = vshufps_avx(auVar120,auVar120,0xff);
  auVar167._0_4_ = fVar209 * auVar48._0_4_;
  auVar167._4_4_ = fVar220 * auVar48._4_4_;
  auVar167._8_4_ = fVar221 * auVar48._8_4_;
  auVar167._12_4_ = fVar222 * auVar48._12_4_;
  local_340 = vsubps_avx(auVar120,auVar167);
  auVar56 = vshufps_avx(auVar50,auVar50,0xff);
  auVar63._0_4_ = auVar56._0_4_ * fVar209 + auVar48._0_4_ * fVar207 * fVar107 * auVar55._0_4_;
  auVar63._4_4_ = auVar56._4_4_ * fVar220 + auVar48._4_4_ * fVar207 * fVar107 * auVar55._4_4_;
  auVar63._8_4_ = auVar56._8_4_ * fVar221 + auVar48._8_4_ * fVar207 * fVar107 * auVar55._8_4_;
  auVar63._12_4_ = auVar56._12_4_ * fVar222 + auVar48._12_4_ * fVar207 * fVar107 * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar50,auVar63);
  local_350._0_4_ = auVar167._0_4_ + auVar120._0_4_;
  local_350._4_4_ = auVar167._4_4_ + auVar120._4_4_;
  fStack_348 = auVar167._8_4_ + auVar120._8_4_;
  fStack_344 = auVar167._12_4_ + auVar120._12_4_;
  auVar48 = vshufps_avx(auVar49,auVar49,0xff);
  auVar69._0_4_ = fVar223 * auVar48._0_4_;
  auVar69._4_4_ = fVar228 * auVar48._4_4_;
  auVar69._8_4_ = fVar229 * auVar48._8_4_;
  auVar69._12_4_ = fVar230 * auVar48._12_4_;
  local_360 = vsubps_avx512vl(auVar49,auVar69);
  auVar56 = vshufps_avx(auVar53,auVar53,0xff);
  auVar58._0_4_ = auVar56._0_4_ * fVar223 + auVar48._0_4_ * fVar208 * auVar54._0_4_ * fVar198;
  auVar58._4_4_ = auVar56._4_4_ * fVar228 + auVar48._4_4_ * fVar208 * auVar54._4_4_ * fVar198;
  auVar58._8_4_ = auVar56._8_4_ * fVar229 + auVar48._8_4_ * fVar208 * auVar54._8_4_ * fVar198;
  auVar58._12_4_ = auVar56._12_4_ * fVar230 + auVar48._12_4_ * fVar208 * auVar54._12_4_ * fVar198;
  auVar48 = vsubps_avx(auVar53,auVar58);
  local_370._0_4_ = auVar49._0_4_ + auVar69._0_4_;
  local_370._4_4_ = auVar49._4_4_ + auVar69._4_4_;
  fStack_368 = auVar49._8_4_ + auVar69._8_4_;
  fStack_364 = auVar49._12_4_ + auVar69._12_4_;
  auVar70._0_4_ = auVar55._0_4_ * 0.33333334;
  auVar70._4_4_ = auVar55._4_4_ * 0.33333334;
  auVar70._8_4_ = auVar55._8_4_ * 0.33333334;
  auVar70._12_4_ = auVar55._12_4_ * 0.33333334;
  local_380 = vaddps_avx512vl(local_340,auVar70);
  auVar73._0_4_ = auVar48._0_4_ * 0.33333334;
  auVar73._4_4_ = auVar48._4_4_ * 0.33333334;
  auVar73._8_4_ = auVar48._8_4_ * 0.33333334;
  auVar73._12_4_ = auVar48._12_4_ * 0.33333334;
  local_390 = vsubps_avx512vl(local_360,auVar73);
  auVar50._0_4_ = (fVar112 + auVar63._0_4_) * 0.33333334;
  auVar50._4_4_ = (fVar113 + auVar63._4_4_) * 0.33333334;
  auVar50._8_4_ = (fVar114 + auVar63._8_4_) * 0.33333334;
  auVar50._12_4_ = (fVar126 + auVar63._12_4_) * 0.33333334;
  _local_3a0 = vaddps_avx512vl(_local_350,auVar50);
  auVar116._0_4_ = (fVar134 + auVar58._0_4_) * 0.33333334;
  auVar116._4_4_ = (fVar141 + auVar58._4_4_) * 0.33333334;
  auVar116._8_4_ = (fVar142 + auVar58._8_4_) * 0.33333334;
  auVar116._12_4_ = (fVar143 + auVar58._12_4_) * 0.33333334;
  _local_3b0 = vsubps_avx512vl(_local_370,auVar116);
  local_2c0 = vsubps_avx(local_340,auVar5);
  uVar115 = local_2c0._0_4_;
  auVar59._4_4_ = uVar115;
  auVar59._0_4_ = uVar115;
  auVar59._8_4_ = uVar115;
  auVar59._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_2c0,local_2c0,0x55);
  aVar2 = pre->ray_space[k].vx.field_0;
  aVar3 = pre->ray_space[k].vy.field_0;
  auVar56 = vshufps_avx(local_2c0,local_2c0,0xaa);
  fVar107 = pre->ray_space[k].vz.field_0.m128[0];
  fVar198 = pre->ray_space[k].vz.field_0.m128[1];
  fVar207 = pre->ray_space[k].vz.field_0.m128[2];
  fVar208 = pre->ray_space[k].vz.field_0.m128[3];
  auVar117._0_4_ = fVar107 * auVar56._0_4_;
  auVar117._4_4_ = fVar198 * auVar56._4_4_;
  auVar117._8_4_ = fVar207 * auVar56._8_4_;
  auVar117._12_4_ = fVar208 * auVar56._12_4_;
  auVar48 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar3,auVar48);
  auVar53 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar59);
  local_2d0 = vsubps_avx512vl(local_380,auVar5);
  uVar115 = local_2d0._0_4_;
  auVar64._4_4_ = uVar115;
  auVar64._0_4_ = uVar115;
  auVar64._8_4_ = uVar115;
  auVar64._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar56 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar60._0_4_ = fVar107 * auVar56._0_4_;
  auVar60._4_4_ = fVar198 * auVar56._4_4_;
  auVar60._8_4_ = fVar207 * auVar56._8_4_;
  auVar60._12_4_ = fVar208 * auVar56._12_4_;
  auVar48 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar3,auVar48);
  auVar52 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar64);
  local_2e0 = vsubps_avx512vl(local_390,auVar5);
  uVar115 = local_2e0._0_4_;
  auVar71._4_4_ = uVar115;
  auVar71._0_4_ = uVar115;
  auVar71._8_4_ = uVar115;
  auVar71._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar56 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar65._0_4_ = fVar107 * auVar56._0_4_;
  auVar65._4_4_ = fVar198 * auVar56._4_4_;
  auVar65._8_4_ = fVar207 * auVar56._8_4_;
  auVar65._12_4_ = fVar208 * auVar56._12_4_;
  auVar48 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar3,auVar48);
  auVar49 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar71);
  local_2f0 = vsubps_avx512vl(local_360,auVar5);
  uVar115 = local_2f0._0_4_;
  auVar168._4_4_ = uVar115;
  auVar168._0_4_ = uVar115;
  auVar168._8_4_ = uVar115;
  auVar168._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar56 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar72._0_4_ = fVar107 * auVar56._0_4_;
  auVar72._4_4_ = fVar198 * auVar56._4_4_;
  auVar72._8_4_ = fVar207 * auVar56._8_4_;
  auVar72._12_4_ = fVar208 * auVar56._12_4_;
  auVar48 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar3,auVar48);
  auVar51 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar168);
  local_300 = vsubps_avx(_local_350,auVar5);
  uVar115 = local_300._0_4_;
  auVar169._4_4_ = uVar115;
  auVar169._0_4_ = uVar115;
  auVar169._8_4_ = uVar115;
  auVar169._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_300,local_300,0x55);
  auVar56 = vshufps_avx(local_300,local_300,0xaa);
  auVar192._0_4_ = auVar56._0_4_ * fVar107;
  auVar192._4_4_ = auVar56._4_4_ * fVar198;
  auVar192._8_4_ = auVar56._8_4_ * fVar207;
  auVar192._12_4_ = auVar56._12_4_ * fVar208;
  auVar48 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar48);
  auVar50 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar169);
  local_310 = vsubps_avx512vl(_local_3a0,auVar5);
  uVar115 = local_310._0_4_;
  auVar170._4_4_ = uVar115;
  auVar170._0_4_ = uVar115;
  auVar170._8_4_ = uVar115;
  auVar170._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_310,local_310,0x55);
  auVar56 = vshufps_avx(local_310,local_310,0xaa);
  auVar199._0_4_ = auVar56._0_4_ * fVar107;
  auVar199._4_4_ = auVar56._4_4_ * fVar198;
  auVar199._8_4_ = auVar56._8_4_ * fVar207;
  auVar199._12_4_ = auVar56._12_4_ * fVar208;
  auVar48 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar3,auVar48);
  auVar116 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar170);
  local_320 = vsubps_avx512vl(_local_3b0,auVar5);
  uVar115 = local_320._0_4_;
  auVar171._4_4_ = uVar115;
  auVar171._0_4_ = uVar115;
  auVar171._8_4_ = uVar115;
  auVar171._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_320,local_320,0x55);
  auVar56 = vshufps_avx(local_320,local_320,0xaa);
  auVar211._0_4_ = auVar56._0_4_ * fVar107;
  auVar211._4_4_ = auVar56._4_4_ * fVar198;
  auVar211._8_4_ = auVar56._8_4_ * fVar207;
  auVar211._12_4_ = auVar56._12_4_ * fVar208;
  auVar48 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar3,auVar48);
  auVar117 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar171);
  local_330 = vsubps_avx(_local_370,auVar5);
  uVar115 = local_330._0_4_;
  auVar61._4_4_ = uVar115;
  auVar61._0_4_ = uVar115;
  auVar61._8_4_ = uVar115;
  auVar61._12_4_ = uVar115;
  auVar48 = vshufps_avx(local_330,local_330,0x55);
  auVar56 = vshufps_avx(local_330,local_330,0xaa);
  auVar161._0_4_ = auVar56._0_4_ * fVar107;
  auVar161._4_4_ = auVar56._4_4_ * fVar198;
  auVar161._8_4_ = auVar56._8_4_ * fVar207;
  auVar161._12_4_ = auVar56._12_4_ * fVar208;
  auVar48 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar3,auVar48);
  auVar5 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar2,auVar61);
  auVar55 = vmovlhps_avx(auVar53,auVar50);
  auVar54 = vmovlhps_avx(auVar52,auVar116);
  auVar4 = vmovlhps_avx512f(auVar49,auVar117);
  _local_2a0 = vmovlhps_avx512f(auVar51,auVar5);
  auVar56 = vminps_avx(auVar55,auVar54);
  auVar48 = vmaxps_avx(auVar55,auVar54);
  auVar57 = vminps_avx512vl(auVar4,_local_2a0);
  auVar56 = vminps_avx(auVar56,auVar57);
  auVar57 = vmaxps_avx512vl(auVar4,_local_2a0);
  auVar48 = vmaxps_avx(auVar48,auVar57);
  auVar57 = vshufpd_avx(auVar56,auVar56,3);
  auVar56 = vminps_avx(auVar56,auVar57);
  auVar57 = vshufpd_avx(auVar48,auVar48,3);
  auVar48 = vmaxps_avx(auVar48,auVar57);
  auVar56 = vandps_avx512vl(auVar56,auVar242._0_16_);
  auVar48 = vandps_avx512vl(auVar48,auVar242._0_16_);
  auVar48 = vmaxps_avx(auVar56,auVar48);
  auVar56 = vmovshdup_avx(auVar48);
  auVar48 = vmaxss_avx(auVar56,auVar48);
  auVar57 = vmovddup_avx512vl(auVar53);
  auVar53 = vmovddup_avx512vl(auVar52);
  auVar52 = vmovddup_avx512vl(auVar49);
  auVar118._8_8_ = auVar51._0_8_;
  auVar118._0_8_ = auVar51._0_8_;
  local_2b0 = ZEXT416((uint)(auVar48._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2b0);
  auVar48 = vxorps_avx512vl(local_260._0_16_,auVar243._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar48);
  uVar37 = 0;
  auVar48 = vsubps_avx(auVar54,auVar55);
  auVar51 = vsubps_avx512vl(auVar4,auVar54);
  local_290 = vsubps_avx512vl(_local_2a0,auVar4);
  local_3c0 = vsubps_avx(_local_350,local_340);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3e0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_3f0 = vsubps_avx512vl(_local_370,local_360);
  local_1e0 = vpbroadcastd_avx512vl();
  local_200 = vpbroadcastd_avx512vl();
  auVar56 = ZEXT816(0x3f80000000000000);
  auVar49 = auVar56;
LAB_019c6630:
  do {
    auVar61 = vshufps_avx(auVar49,auVar49,0x50);
    auVar231._8_4_ = 0x3f800000;
    auVar231._0_8_ = 0x3f8000003f800000;
    auVar231._12_4_ = 0x3f800000;
    auVar234._16_4_ = 0x3f800000;
    auVar234._0_16_ = auVar231;
    auVar234._20_4_ = 0x3f800000;
    auVar234._24_4_ = 0x3f800000;
    auVar234._28_4_ = 0x3f800000;
    auVar120 = vsubps_avx(auVar231,auVar61);
    fVar107 = auVar61._0_4_;
    fVar112 = auVar50._0_4_;
    auVar135._0_4_ = fVar112 * fVar107;
    fVar198 = auVar61._4_4_;
    fVar113 = auVar50._4_4_;
    auVar135._4_4_ = fVar113 * fVar198;
    fVar207 = auVar61._8_4_;
    auVar135._8_4_ = fVar112 * fVar207;
    fVar208 = auVar61._12_4_;
    auVar135._12_4_ = fVar113 * fVar208;
    fVar114 = auVar116._0_4_;
    auVar144._0_4_ = fVar114 * fVar107;
    fVar126 = auVar116._4_4_;
    auVar144._4_4_ = fVar126 * fVar198;
    auVar144._8_4_ = fVar114 * fVar207;
    auVar144._12_4_ = fVar126 * fVar208;
    fVar134 = auVar117._0_4_;
    auVar154._0_4_ = fVar134 * fVar107;
    fVar141 = auVar117._4_4_;
    auVar154._4_4_ = fVar141 * fVar198;
    auVar154._8_4_ = fVar134 * fVar207;
    auVar154._12_4_ = fVar141 * fVar208;
    fVar142 = auVar5._0_4_;
    auVar121._0_4_ = fVar142 * fVar107;
    fVar143 = auVar5._4_4_;
    auVar121._4_4_ = fVar143 * fVar198;
    auVar121._8_4_ = fVar142 * fVar207;
    auVar121._12_4_ = fVar143 * fVar208;
    auVar58 = vfmadd231ps_avx512vl(auVar135,auVar120,auVar57);
    auVar59 = vfmadd231ps_avx512vl(auVar144,auVar120,auVar53);
    auVar60 = vfmadd231ps_avx512vl(auVar154,auVar120,auVar52);
    auVar120 = vfmadd231ps_fma(auVar121,auVar118,auVar120);
    auVar61 = vmovshdup_avx(auVar56);
    fVar198 = auVar56._0_4_;
    fVar107 = (auVar61._0_4_ - fVar198) * 0.04761905;
    auVar179._4_4_ = fVar198;
    auVar179._0_4_ = fVar198;
    auVar179._8_4_ = fVar198;
    auVar179._12_4_ = fVar198;
    auVar179._16_4_ = fVar198;
    auVar179._20_4_ = fVar198;
    auVar179._24_4_ = fVar198;
    auVar179._28_4_ = fVar198;
    auVar132._0_8_ = auVar61._0_8_;
    auVar132._8_8_ = auVar132._0_8_;
    auVar132._16_8_ = auVar132._0_8_;
    auVar132._24_8_ = auVar132._0_8_;
    auVar81 = vsubps_avx(auVar132,auVar179);
    uVar115 = auVar58._0_4_;
    auVar133._4_4_ = uVar115;
    auVar133._0_4_ = uVar115;
    auVar133._8_4_ = uVar115;
    auVar133._12_4_ = uVar115;
    auVar133._16_4_ = uVar115;
    auVar133._20_4_ = uVar115;
    auVar133._24_4_ = uVar115;
    auVar133._28_4_ = uVar115;
    auVar195._8_4_ = 1;
    auVar195._0_8_ = 0x100000001;
    auVar195._12_4_ = 1;
    auVar195._16_4_ = 1;
    auVar195._20_4_ = 1;
    auVar195._24_4_ = 1;
    auVar195._28_4_ = 1;
    auVar90 = ZEXT1632(auVar58);
    auVar78 = vpermps_avx2(auVar195,auVar90);
    auVar79 = vbroadcastss_avx512vl(auVar59);
    auVar91 = ZEXT1632(auVar59);
    auVar80 = vpermps_avx512vl(auVar195,auVar91);
    auVar82 = vbroadcastss_avx512vl(auVar60);
    auVar75 = ZEXT1632(auVar60);
    auVar83 = vpermps_avx512vl(auVar195,auVar75);
    auVar84 = vbroadcastss_avx512vl(auVar120);
    auVar87 = ZEXT1632(auVar120);
    auVar85 = vpermps_avx512vl(auVar195,auVar87);
    auVar196._4_4_ = fVar107;
    auVar196._0_4_ = fVar107;
    auVar196._8_4_ = fVar107;
    auVar196._12_4_ = fVar107;
    auVar196._16_4_ = fVar107;
    auVar196._20_4_ = fVar107;
    auVar196._24_4_ = fVar107;
    auVar196._28_4_ = fVar107;
    auVar88 = auVar248._0_32_;
    auVar76 = vpermps_avx512vl(auVar88,auVar90);
    auVar166._8_4_ = 3;
    auVar166._0_8_ = 0x300000003;
    auVar166._12_4_ = 3;
    auVar166._16_4_ = 3;
    auVar166._20_4_ = 3;
    auVar166._24_4_ = 3;
    auVar166._28_4_ = 3;
    auVar77 = vpermps_avx512vl(auVar166,auVar90);
    auVar86 = vpermps_avx512vl(auVar88,auVar91);
    auVar90 = vpermps_avx2(auVar166,auVar91);
    auVar74 = vpermps_avx512vl(auVar88,auVar75);
    auVar91 = vpermps_avx2(auVar166,auVar75);
    auVar75 = vpermps_avx512vl(auVar88,auVar87);
    auVar87 = vpermps_avx512vl(auVar166,auVar87);
    auVar61 = vfmadd132ps_fma(auVar81,auVar179,_DAT_01f7b040);
    auVar81 = vsubps_avx(auVar234,ZEXT1632(auVar61));
    auVar88 = vmulps_avx512vl(auVar79,ZEXT1632(auVar61));
    auVar92 = ZEXT1632(auVar61);
    auVar89 = vmulps_avx512vl(auVar80,auVar92);
    auVar120 = vfmadd231ps_fma(auVar88,auVar81,auVar133);
    auVar58 = vfmadd231ps_fma(auVar89,auVar81,auVar78);
    auVar88 = vmulps_avx512vl(auVar82,auVar92);
    auVar89 = vmulps_avx512vl(auVar83,auVar92);
    auVar79 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar89,auVar81,auVar80);
    auVar88 = vmulps_avx512vl(auVar84,auVar92);
    auVar89 = ZEXT1632(auVar61);
    auVar85 = vmulps_avx512vl(auVar85,auVar89);
    auVar82 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar82);
    auVar83 = vfmadd231ps_avx512vl(auVar85,auVar81,auVar83);
    fVar207 = auVar61._0_4_;
    fVar208 = auVar61._4_4_;
    auVar22._4_4_ = fVar208 * auVar79._4_4_;
    auVar22._0_4_ = fVar207 * auVar79._0_4_;
    fVar209 = auVar61._8_4_;
    auVar22._8_4_ = fVar209 * auVar79._8_4_;
    fVar220 = auVar61._12_4_;
    auVar22._12_4_ = fVar220 * auVar79._12_4_;
    auVar22._16_4_ = auVar79._16_4_ * 0.0;
    auVar22._20_4_ = auVar79._20_4_ * 0.0;
    auVar22._24_4_ = auVar79._24_4_ * 0.0;
    auVar22._28_4_ = fVar198;
    auVar23._4_4_ = fVar208 * auVar80._4_4_;
    auVar23._0_4_ = fVar207 * auVar80._0_4_;
    auVar23._8_4_ = fVar209 * auVar80._8_4_;
    auVar23._12_4_ = fVar220 * auVar80._12_4_;
    auVar23._16_4_ = auVar80._16_4_ * 0.0;
    auVar23._20_4_ = auVar80._20_4_ * 0.0;
    auVar23._24_4_ = auVar80._24_4_ * 0.0;
    auVar23._28_4_ = auVar78._28_4_;
    auVar120 = vfmadd231ps_fma(auVar22,auVar81,ZEXT1632(auVar120));
    auVar58 = vfmadd231ps_fma(auVar23,auVar81,ZEXT1632(auVar58));
    auVar124._0_4_ = fVar207 * auVar82._0_4_;
    auVar124._4_4_ = fVar208 * auVar82._4_4_;
    auVar124._8_4_ = fVar209 * auVar82._8_4_;
    auVar124._12_4_ = fVar220 * auVar82._12_4_;
    auVar124._16_4_ = auVar82._16_4_ * 0.0;
    auVar124._20_4_ = auVar82._20_4_ * 0.0;
    auVar124._24_4_ = auVar82._24_4_ * 0.0;
    auVar124._28_4_ = 0;
    auVar24._4_4_ = fVar208 * auVar83._4_4_;
    auVar24._0_4_ = fVar207 * auVar83._0_4_;
    auVar24._8_4_ = fVar209 * auVar83._8_4_;
    auVar24._12_4_ = fVar220 * auVar83._12_4_;
    auVar24._16_4_ = auVar83._16_4_ * 0.0;
    auVar24._20_4_ = auVar83._20_4_ * 0.0;
    auVar24._24_4_ = auVar83._24_4_ * 0.0;
    auVar24._28_4_ = auVar82._28_4_;
    auVar59 = vfmadd231ps_fma(auVar124,auVar81,auVar79);
    auVar60 = vfmadd231ps_fma(auVar24,auVar81,auVar80);
    auVar25._28_4_ = auVar80._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar220 * auVar60._12_4_,
                            CONCAT48(fVar209 * auVar60._8_4_,
                                     CONCAT44(fVar208 * auVar60._4_4_,fVar207 * auVar60._0_4_))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar220 * auVar59._12_4_,
                                                 CONCAT48(fVar209 * auVar59._8_4_,
                                                          CONCAT44(fVar208 * auVar59._4_4_,
                                                                   fVar207 * auVar59._0_4_)))),
                              auVar81,ZEXT1632(auVar120));
    auVar73 = vfmadd231ps_fma(auVar25,auVar81,ZEXT1632(auVar58));
    auVar78 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar120));
    auVar79 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar58));
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar78 = vmulps_avx512vl(auVar78,auVar80);
    auVar79 = vmulps_avx512vl(auVar79,auVar80);
    auVar190._0_4_ = fVar107 * auVar78._0_4_;
    auVar190._4_4_ = fVar107 * auVar78._4_4_;
    auVar190._8_4_ = fVar107 * auVar78._8_4_;
    auVar190._12_4_ = fVar107 * auVar78._12_4_;
    auVar190._16_4_ = fVar107 * auVar78._16_4_;
    auVar190._20_4_ = fVar107 * auVar78._20_4_;
    auVar190._24_4_ = fVar107 * auVar78._24_4_;
    auVar190._28_4_ = 0;
    auVar78 = vmulps_avx512vl(auVar196,auVar79);
    auVar58 = vxorps_avx512vl(auVar84._0_16_,auVar84._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar70),_DAT_01fb9fc0,ZEXT1632(auVar58));
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar73),_DAT_01fb9fc0,ZEXT1632(auVar58));
    auVar125._0_4_ = auVar190._0_4_ + auVar70._0_4_;
    auVar125._4_4_ = auVar190._4_4_ + auVar70._4_4_;
    auVar125._8_4_ = auVar190._8_4_ + auVar70._8_4_;
    auVar125._12_4_ = auVar190._12_4_ + auVar70._12_4_;
    auVar125._16_4_ = auVar190._16_4_ + 0.0;
    auVar125._20_4_ = auVar190._20_4_ + 0.0;
    auVar125._24_4_ = auVar190._24_4_ + 0.0;
    auVar125._28_4_ = 0;
    auVar92 = ZEXT1632(auVar58);
    auVar83 = vpermt2ps_avx512vl(auVar190,_DAT_01fb9fc0,auVar92);
    auVar84 = vaddps_avx512vl(ZEXT1632(auVar73),auVar78);
    auVar85 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,auVar92);
    auVar78 = vsubps_avx(auVar79,auVar83);
    auVar83 = vsubps_avx512vl(auVar82,auVar85);
    auVar85 = vmulps_avx512vl(auVar86,auVar89);
    auVar88 = vmulps_avx512vl(auVar90,auVar89);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar77);
    auVar77 = vmulps_avx512vl(auVar74,auVar89);
    auVar88 = vmulps_avx512vl(auVar91,auVar89);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar86);
    auVar90 = vfmadd231ps_avx512vl(auVar88,auVar81,auVar90);
    auVar86 = vmulps_avx512vl(auVar75,auVar89);
    auVar75 = vmulps_avx512vl(auVar87,auVar89);
    auVar120 = vfmadd231ps_fma(auVar86,auVar81,auVar74);
    auVar86 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar91);
    auVar74 = vmulps_avx512vl(auVar89,auVar77);
    auVar87 = ZEXT1632(auVar61);
    auVar75 = vmulps_avx512vl(auVar87,auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar74,auVar81,auVar85);
    auVar76 = vfmadd231ps_avx512vl(auVar75,auVar81,auVar76);
    auVar86 = vmulps_avx512vl(auVar87,auVar86);
    auVar77 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar220 * auVar120._12_4_,
                                            CONCAT48(fVar209 * auVar120._8_4_,
                                                     CONCAT44(fVar208 * auVar120._4_4_,
                                                              fVar207 * auVar120._0_4_)))),auVar81,
                         auVar77);
    auVar90 = vfmadd231ps_avx512vl(auVar86,auVar81,auVar90);
    auVar26._4_4_ = fVar208 * auVar77._4_4_;
    auVar26._0_4_ = fVar207 * auVar77._0_4_;
    auVar26._8_4_ = fVar209 * auVar77._8_4_;
    auVar26._12_4_ = fVar220 * auVar77._12_4_;
    auVar26._16_4_ = auVar77._16_4_ * 0.0;
    auVar26._20_4_ = auVar77._20_4_ * 0.0;
    auVar26._24_4_ = auVar77._24_4_ * 0.0;
    auVar26._28_4_ = auVar91._28_4_;
    auVar91 = vmulps_avx512vl(auVar87,auVar90);
    auVar86 = vfmadd231ps_avx512vl(auVar26,auVar81,auVar85);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar76,auVar81);
    auVar81 = vsubps_avx512vl(auVar77,auVar85);
    auVar90 = vsubps_avx512vl(auVar90,auVar76);
    auVar81 = vmulps_avx512vl(auVar81,auVar80);
    auVar90 = vmulps_avx512vl(auVar90,auVar80);
    fVar198 = fVar107 * auVar81._0_4_;
    fVar207 = fVar107 * auVar81._4_4_;
    auVar27._4_4_ = fVar207;
    auVar27._0_4_ = fVar198;
    fVar208 = fVar107 * auVar81._8_4_;
    auVar27._8_4_ = fVar208;
    fVar209 = fVar107 * auVar81._12_4_;
    auVar27._12_4_ = fVar209;
    fVar220 = fVar107 * auVar81._16_4_;
    auVar27._16_4_ = fVar220;
    fVar221 = fVar107 * auVar81._20_4_;
    auVar27._20_4_ = fVar221;
    fVar107 = fVar107 * auVar81._24_4_;
    auVar27._24_4_ = fVar107;
    auVar27._28_4_ = auVar81._28_4_;
    auVar90 = vmulps_avx512vl(auVar196,auVar90);
    auVar80 = vpermt2ps_avx512vl(auVar86,_DAT_01fb9fc0,auVar92);
    auVar85 = vpermt2ps_avx512vl(auVar91,_DAT_01fb9fc0,auVar92);
    auVar197._0_4_ = auVar86._0_4_ + fVar198;
    auVar197._4_4_ = auVar86._4_4_ + fVar207;
    auVar197._8_4_ = auVar86._8_4_ + fVar208;
    auVar197._12_4_ = auVar86._12_4_ + fVar209;
    auVar197._16_4_ = auVar86._16_4_ + fVar220;
    auVar197._20_4_ = auVar86._20_4_ + fVar221;
    auVar197._24_4_ = auVar86._24_4_ + fVar107;
    auVar197._28_4_ = auVar86._28_4_ + auVar81._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar27,_DAT_01fb9fc0,ZEXT1632(auVar58));
    auVar76 = vaddps_avx512vl(auVar91,auVar90);
    auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,ZEXT1632(auVar58));
    auVar81 = vsubps_avx(auVar80,auVar81);
    auVar90 = vsubps_avx512vl(auVar85,auVar90);
    auVar138 = ZEXT1632(auVar70);
    auVar77 = vsubps_avx512vl(auVar86,auVar138);
    auVar150 = ZEXT1632(auVar73);
    auVar74 = vsubps_avx512vl(auVar91,auVar150);
    auVar75 = vsubps_avx512vl(auVar80,auVar79);
    auVar77 = vaddps_avx512vl(auVar77,auVar75);
    auVar75 = vsubps_avx512vl(auVar85,auVar82);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar150,auVar77);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar138,auVar74);
    auVar87 = vmulps_avx512vl(auVar84,auVar77);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar125,auVar74);
    auVar88 = vmulps_avx512vl(auVar83,auVar77);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar78,auVar74);
    auVar89 = vmulps_avx512vl(auVar82,auVar77);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar79,auVar74);
    auVar92 = vmulps_avx512vl(auVar91,auVar77);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar86,auVar74);
    auVar93 = vmulps_avx512vl(auVar76,auVar77);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar197,auVar74);
    auVar94 = vmulps_avx512vl(auVar90,auVar77);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar81,auVar74);
    auVar77 = vmulps_avx512vl(auVar85,auVar77);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar80,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar87);
    auVar75 = vmaxps_avx512vl(auVar75,auVar87);
    auVar87 = vminps_avx512vl(auVar88,auVar89);
    auVar74 = vminps_avx512vl(auVar74,auVar87);
    auVar87 = vmaxps_avx512vl(auVar88,auVar89);
    auVar75 = vmaxps_avx512vl(auVar75,auVar87);
    auVar87 = vminps_avx512vl(auVar92,auVar93);
    auVar88 = vmaxps_avx512vl(auVar92,auVar93);
    auVar89 = vminps_avx512vl(auVar94,auVar77);
    auVar87 = vminps_avx512vl(auVar87,auVar89);
    auVar74 = vminps_avx512vl(auVar74,auVar87);
    auVar77 = vmaxps_avx512vl(auVar94,auVar77);
    auVar77 = vmaxps_avx512vl(auVar88,auVar77);
    auVar77 = vmaxps_avx512vl(auVar75,auVar77);
    uVar16 = vcmpps_avx512vl(auVar74,local_260,2);
    uVar17 = vcmpps_avx512vl(auVar77,local_280,5);
    bVar35 = (byte)uVar16 & (byte)uVar17 & 0x7f;
    if (bVar35 != 0) {
      auVar77 = vsubps_avx512vl(auVar79,auVar138);
      auVar74 = vsubps_avx512vl(auVar82,auVar150);
      auVar75 = vsubps_avx512vl(auVar80,auVar86);
      auVar77 = vaddps_avx512vl(auVar77,auVar75);
      auVar75 = vsubps_avx512vl(auVar85,auVar91);
      auVar74 = vaddps_avx512vl(auVar74,auVar75);
      auVar75 = vmulps_avx512vl(auVar150,auVar77);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar138);
      auVar84 = vmulps_avx512vl(auVar84,auVar77);
      auVar84 = vfnmadd213ps_avx512vl(auVar125,auVar74,auVar84);
      auVar83 = vmulps_avx512vl(auVar83,auVar77);
      auVar83 = vfnmadd213ps_avx512vl(auVar78,auVar74,auVar83);
      auVar78 = vmulps_avx512vl(auVar82,auVar77);
      auVar82 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar79);
      auVar78 = vmulps_avx512vl(auVar91,auVar77);
      auVar91 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar86);
      auVar78 = vmulps_avx512vl(auVar76,auVar77);
      auVar76 = vfnmadd213ps_avx512vl(auVar197,auVar74,auVar78);
      auVar78 = vmulps_avx512vl(auVar90,auVar77);
      auVar86 = vfnmadd213ps_avx512vl(auVar81,auVar74,auVar78);
      auVar81 = vmulps_avx512vl(auVar85,auVar77);
      auVar80 = vfnmadd231ps_avx512vl(auVar81,auVar80,auVar74);
      auVar78 = vminps_avx(auVar75,auVar84);
      auVar81 = vmaxps_avx(auVar75,auVar84);
      auVar79 = vminps_avx(auVar83,auVar82);
      auVar79 = vminps_avx(auVar78,auVar79);
      auVar78 = vmaxps_avx(auVar83,auVar82);
      auVar81 = vmaxps_avx(auVar81,auVar78);
      auVar90 = vminps_avx(auVar91,auVar76);
      auVar78 = vmaxps_avx(auVar91,auVar76);
      auVar91 = vminps_avx(auVar86,auVar80);
      auVar90 = vminps_avx(auVar90,auVar91);
      auVar90 = vminps_avx(auVar79,auVar90);
      auVar79 = vmaxps_avx(auVar86,auVar80);
      auVar78 = vmaxps_avx(auVar78,auVar79);
      auVar81 = vmaxps_avx(auVar81,auVar78);
      uVar16 = vcmpps_avx512vl(auVar81,local_280,5);
      uVar17 = vcmpps_avx512vl(auVar90,local_260,2);
      bVar35 = bVar35 & (byte)uVar16 & (byte)uVar17;
      if (bVar35 != 0) {
        auStack_430[uVar37] = (uint)bVar35;
        uVar16 = vmovlps_avx(auVar56);
        (&uStack_240)[uVar37] = uVar16;
        uVar43 = vmovlps_avx(auVar49);
        auStack_1a0[uVar37] = uVar43;
        uVar37 = (ulong)((int)uVar37 + 1);
      }
    }
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar241 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar242 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar243 = ZEXT1664(auVar56);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar244 = ZEXT3264(auVar81);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar245 = ZEXT1664(auVar56);
    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar246 = ZEXT1664(auVar56);
    auVar247 = ZEXT3264(_DAT_01fb9fe0);
LAB_019c6b2e:
    do {
      do {
        do {
          if ((int)uVar37 == 0) {
            uVar115 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar21._4_4_ = uVar115;
            auVar21._0_4_ = uVar115;
            auVar21._8_4_ = uVar115;
            auVar21._12_4_ = uVar115;
            auVar21._16_4_ = uVar115;
            auVar21._20_4_ = uVar115;
            auVar21._24_4_ = uVar115;
            auVar21._28_4_ = uVar115;
            uVar16 = vcmpps_avx512vl(local_1c0,auVar21,2);
            uVar42 = (ulong)((uint)uVar42 & (uint)uVar16);
            goto LAB_019c5edc;
          }
          uVar36 = (int)uVar37 - 1;
          uVar38 = (ulong)uVar36;
          uVar8 = auStack_430[uVar38];
          auVar49._8_8_ = 0;
          auVar49._0_8_ = auStack_1a0[uVar38];
          uVar43 = 0;
          for (uVar41 = (ulong)uVar8; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000)
          {
            uVar43 = uVar43 + 1;
          }
          uVar40 = uVar8 - 1 & uVar8;
          bVar46 = uVar40 == 0;
          auStack_430[uVar38] = uVar40;
          if (bVar46) {
            uVar37 = (ulong)uVar36;
          }
          auVar108._8_8_ = 0;
          auVar108._0_8_ = uVar43;
          auVar56 = vpunpcklqdq_avx(auVar108,ZEXT416((int)uVar43 + 1));
          auVar56 = vcvtqq2ps_avx512vl(auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar245._0_16_);
          uVar115 = *(undefined4 *)((long)&uStack_240 + uVar38 * 8 + 4);
          auVar18._4_4_ = uVar115;
          auVar18._0_4_ = uVar115;
          auVar18._8_4_ = uVar115;
          auVar18._12_4_ = uVar115;
          auVar61 = vmulps_avx512vl(auVar56,auVar18);
          auVar120 = auVar246._0_16_;
          auVar56 = vsubps_avx512vl(auVar120,auVar56);
          uVar115 = *(undefined4 *)(&uStack_240 + uVar38);
          auVar19._4_4_ = uVar115;
          auVar19._0_4_ = uVar115;
          auVar19._8_4_ = uVar115;
          auVar19._12_4_ = uVar115;
          auVar56 = vfmadd231ps_avx512vl(auVar61,auVar56,auVar19);
          auVar61 = vmovshdup_avx(auVar56);
          fVar107 = auVar61._0_4_ - auVar56._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar107));
          if (uVar8 == 0 || bVar46) goto LAB_019c6630;
          auVar61 = vshufps_avx(auVar49,auVar49,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar107));
          auVar60 = vsubps_avx512vl(auVar120,auVar61);
          fVar198 = auVar61._0_4_;
          auVar145._0_4_ = fVar198 * fVar112;
          fVar207 = auVar61._4_4_;
          auVar145._4_4_ = fVar207 * fVar113;
          fVar208 = auVar61._8_4_;
          auVar145._8_4_ = fVar208 * fVar112;
          fVar209 = auVar61._12_4_;
          auVar145._12_4_ = fVar209 * fVar113;
          auVar155._0_4_ = fVar198 * fVar114;
          auVar155._4_4_ = fVar207 * fVar126;
          auVar155._8_4_ = fVar208 * fVar114;
          auVar155._12_4_ = fVar209 * fVar126;
          auVar162._0_4_ = fVar198 * fVar134;
          auVar162._4_4_ = fVar207 * fVar141;
          auVar162._8_4_ = fVar208 * fVar134;
          auVar162._12_4_ = fVar209 * fVar141;
          auVar127._0_4_ = fVar198 * fVar142;
          auVar127._4_4_ = fVar207 * fVar143;
          auVar127._8_4_ = fVar208 * fVar142;
          auVar127._12_4_ = fVar209 * fVar143;
          auVar61 = vfmadd231ps_fma(auVar145,auVar60,auVar57);
          auVar58 = vfmadd231ps_fma(auVar155,auVar60,auVar53);
          auVar59 = vfmadd231ps_fma(auVar162,auVar60,auVar52);
          auVar60 = vfmadd231ps_fma(auVar127,auVar60,auVar118);
          auVar139._16_16_ = auVar61;
          auVar139._0_16_ = auVar61;
          auVar151._16_16_ = auVar58;
          auVar151._0_16_ = auVar58;
          auVar159._16_16_ = auVar59;
          auVar159._0_16_ = auVar59;
          auVar78 = vpermps_avx512vl(auVar247._0_32_,ZEXT1632(auVar56));
          auVar81 = vsubps_avx(auVar151,auVar139);
          auVar58 = vfmadd213ps_fma(auVar81,auVar78,auVar139);
          auVar81 = vsubps_avx(auVar159,auVar151);
          auVar70 = vfmadd213ps_fma(auVar81,auVar78,auVar151);
          auVar61 = vsubps_avx(auVar60,auVar59);
          auVar152._16_16_ = auVar61;
          auVar152._0_16_ = auVar61;
          auVar61 = vfmadd213ps_fma(auVar152,auVar78,auVar159);
          auVar81 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar58));
          auVar58 = vfmadd213ps_fma(auVar81,auVar78,ZEXT1632(auVar58));
          auVar81 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar70));
          auVar61 = vfmadd213ps_fma(auVar81,auVar78,ZEXT1632(auVar70));
          auVar81 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar58));
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar81,auVar78);
          auVar81 = vmulps_avx512vl(auVar81,auVar244._0_32_);
          auVar96._16_16_ = auVar81._16_16_;
          fVar198 = fVar107 * 0.33333334;
          auVar163._0_8_ =
               CONCAT44(auVar153._4_4_ + fVar198 * auVar81._4_4_,
                        auVar153._0_4_ + fVar198 * auVar81._0_4_);
          auVar163._8_4_ = auVar153._8_4_ + fVar198 * auVar81._8_4_;
          auVar163._12_4_ = auVar153._12_4_ + fVar198 * auVar81._12_4_;
          auVar146._0_4_ = fVar198 * auVar81._16_4_;
          auVar146._4_4_ = fVar198 * auVar81._20_4_;
          auVar146._8_4_ = fVar198 * auVar81._24_4_;
          auVar146._12_4_ = fVar198 * auVar81._28_4_;
          auVar68 = vsubps_avx((undefined1  [16])0x0,auVar146);
          auVar70 = vshufpd_avx(auVar153,auVar153,3);
          auVar73 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar61 = vsubps_avx(auVar70,auVar153);
          auVar58 = vsubps_avx(auVar73,(undefined1  [16])0x0);
          auVar183._0_4_ = auVar61._0_4_ + auVar58._0_4_;
          auVar183._4_4_ = auVar61._4_4_ + auVar58._4_4_;
          auVar183._8_4_ = auVar61._8_4_ + auVar58._8_4_;
          auVar183._12_4_ = auVar61._12_4_ + auVar58._12_4_;
          auVar61 = vshufps_avx(auVar153,auVar153,0xb1);
          auVar58 = vshufps_avx(auVar163,auVar163,0xb1);
          auVar59 = vshufps_avx(auVar68,auVar68,0xb1);
          auVar60 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar232._4_4_ = auVar183._0_4_;
          auVar232._0_4_ = auVar183._0_4_;
          auVar232._8_4_ = auVar183._0_4_;
          auVar232._12_4_ = auVar183._0_4_;
          auVar64 = vshufps_avx(auVar183,auVar183,0x55);
          fVar198 = auVar64._0_4_;
          auVar193._0_4_ = auVar61._0_4_ * fVar198;
          fVar207 = auVar64._4_4_;
          auVar193._4_4_ = auVar61._4_4_ * fVar207;
          fVar208 = auVar64._8_4_;
          auVar193._8_4_ = auVar61._8_4_ * fVar208;
          fVar209 = auVar64._12_4_;
          auVar193._12_4_ = auVar61._12_4_ * fVar209;
          auVar200._0_4_ = auVar58._0_4_ * fVar198;
          auVar200._4_4_ = auVar58._4_4_ * fVar207;
          auVar200._8_4_ = auVar58._8_4_ * fVar208;
          auVar200._12_4_ = auVar58._12_4_ * fVar209;
          auVar212._0_4_ = auVar59._0_4_ * fVar198;
          auVar212._4_4_ = auVar59._4_4_ * fVar207;
          auVar212._8_4_ = auVar59._8_4_ * fVar208;
          auVar212._12_4_ = auVar59._12_4_ * fVar209;
          auVar184._0_4_ = auVar60._0_4_ * fVar198;
          auVar184._4_4_ = auVar60._4_4_ * fVar207;
          auVar184._8_4_ = auVar60._8_4_ * fVar208;
          auVar184._12_4_ = auVar60._12_4_ * fVar209;
          auVar61 = vfmadd231ps_fma(auVar193,auVar232,auVar153);
          auVar58 = vfmadd231ps_fma(auVar200,auVar232,auVar163);
          auVar66 = vfmadd231ps_fma(auVar212,auVar232,auVar68);
          auVar67 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar232);
          auVar64 = vshufpd_avx(auVar61,auVar61,1);
          auVar65 = vshufpd_avx(auVar58,auVar58,1);
          auVar62 = vshufpd_avx512vl(auVar66,auVar66,1);
          auVar63 = vshufpd_avx512vl(auVar67,auVar67,1);
          auVar59 = vminss_avx(auVar61,auVar58);
          auVar61 = vmaxss_avx(auVar58,auVar61);
          auVar60 = vminss_avx(auVar66,auVar67);
          auVar58 = vmaxss_avx(auVar67,auVar66);
          auVar59 = vminss_avx(auVar59,auVar60);
          auVar61 = vmaxss_avx(auVar58,auVar61);
          auVar60 = vminss_avx(auVar64,auVar65);
          auVar58 = vmaxss_avx(auVar65,auVar64);
          auVar64 = vminss_avx512f(auVar62,auVar63);
          auVar65 = vmaxss_avx512f(auVar63,auVar62);
          auVar58 = vmaxss_avx(auVar65,auVar58);
          auVar60 = vminss_avx512f(auVar60,auVar64);
          fVar207 = auVar58._0_4_;
          fVar198 = auVar61._0_4_;
          if (auVar59._0_4_ < 0.0001) {
            bVar47 = fVar207 == -0.0001;
            bVar44 = NAN(fVar207);
            if (fVar207 <= -0.0001) goto LAB_019c6d66;
            break;
          }
LAB_019c6d66:
          vucomiss_avx512f(auVar60);
          bVar47 = fVar207 <= -0.0001;
          bVar45 = -0.0001 < fVar198;
          bVar44 = bVar47;
          if (!bVar47) break;
          uVar16 = vcmpps_avx512vl(auVar59,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar17 = vcmpps_avx512vl(auVar60,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar36 = (uint)uVar16 & (uint)uVar17;
          bVar13 = (uVar36 & 1) == 0;
          bVar47 = bVar45 && bVar13;
          bVar44 = bVar45 && (uVar36 & 1) == 0;
        } while (!bVar45 || !bVar13);
        auVar66 = auVar249._0_16_;
        vcmpss_avx512f(auVar59,auVar66,1);
        uVar16 = vcmpss_avx512f(auVar61,auVar66,1);
        bVar45 = (bool)((byte)uVar16 & 1);
        auVar96._0_16_ = auVar250._0_16_;
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (float)((uint)bVar45 * -0x40800000 + (uint)!bVar45 * auVar250._0_4_);
        vucomiss_avx512f(auVar95._0_16_);
        bVar44 = (bool)(!bVar47 | bVar44);
        bVar45 = bVar44 == false;
        auVar98._16_16_ = auVar96._16_16_;
        auVar98._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar44 * auVar249._0_4_ + (uint)!bVar44 * 0x7f800000;
        auVar65 = auVar97._0_16_;
        auVar100._16_16_ = auVar96._16_16_;
        auVar100._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar44 * auVar249._0_4_ + (uint)!bVar44 * -0x800000;
        auVar64 = auVar99._0_16_;
        uVar16 = vcmpss_avx512f(auVar60,auVar66,1);
        bVar47 = (bool)((byte)uVar16 & 1);
        auVar102._16_16_ = auVar96._16_16_;
        auVar102._0_16_ = auVar250._0_16_;
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * auVar250._0_4_);
        vucomiss_avx512f(auVar101._0_16_);
        if ((bVar44) || (bVar45)) {
          auVar60 = vucomiss_avx512f(auVar59);
          if ((bVar44) || (bVar45)) {
            auVar67 = vxorps_avx512vl(auVar59,auVar243._0_16_);
            auVar59 = vsubss_avx512f(auVar60,auVar59);
            auVar59 = vdivss_avx512f(auVar67,auVar59);
            auVar60 = vsubss_avx512f(ZEXT416(0x3f800000),auVar59);
            auVar60 = vfmadd213ss_avx512f(auVar60,auVar66,auVar59);
            auVar59 = auVar60;
          }
          else {
            auVar59 = vxorps_avx512vl(auVar60,auVar60);
            vucomiss_avx512f(auVar59);
            auVar60 = ZEXT416(0x3f800000);
            if ((bVar44) || (bVar45)) {
              auVar60 = SUB6416(ZEXT464(0xff800000),0);
              auVar59 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar65 = vminss_avx512f(auVar65,auVar59);
          auVar64 = vmaxss_avx(auVar60,auVar64);
        }
        auVar250 = ZEXT464(0x3f800000);
        uVar16 = vcmpss_avx512f(auVar58,auVar66,1);
        bVar47 = (bool)((byte)uVar16 & 1);
        auVar58 = auVar250._0_16_;
        fVar208 = (float)((uint)bVar47 * -0x40800000 + (uint)!bVar47 * 0x3f800000);
        if ((auVar95._0_4_ != fVar208) || (NAN(auVar95._0_4_) || NAN(fVar208))) {
          if ((fVar207 != fVar198) || (NAN(fVar207) || NAN(fVar198))) {
            auVar61 = vxorps_avx512vl(auVar61,auVar243._0_16_);
            auVar185._0_4_ = auVar61._0_4_ / (fVar207 - fVar198);
            auVar185._4_12_ = auVar61._4_12_;
            auVar61 = vsubss_avx512f(auVar58,auVar185);
            auVar61 = vfmadd213ss_avx512f(auVar61,auVar66,auVar185);
            auVar59 = auVar61;
          }
          else if ((fVar198 != 0.0) ||
                  (auVar61 = auVar58, auVar59 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar198))) {
            auVar61 = SUB6416(ZEXT464(0xff800000),0);
            auVar59 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar65 = vminss_avx(auVar65,auVar59);
          auVar64 = vmaxss_avx(auVar61,auVar64);
        }
        bVar47 = auVar101._0_4_ != fVar208;
        auVar61 = vminss_avx512f(auVar65,auVar58);
        auVar104._16_16_ = auVar96._16_16_;
        auVar104._0_16_ = auVar65;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar47 * auVar61._0_4_ + (uint)!bVar47 * auVar65._0_4_;
        auVar61 = vmaxss_avx512f(auVar58,auVar64);
        auVar106._16_16_ = auVar96._16_16_;
        auVar106._0_16_ = auVar64;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar47 * auVar61._0_4_ + (uint)!bVar47 * auVar64._0_4_;
        auVar61 = vmaxss_avx512f(auVar66,auVar103._0_16_);
        auVar59 = vminss_avx512f(auVar105._0_16_,auVar58);
      } while (auVar59._0_4_ < auVar61._0_4_);
      auVar66 = vmaxss_avx512f(auVar66,ZEXT416((uint)(auVar61._0_4_ + -0.1)));
      auVar67 = vminss_avx512f(ZEXT416((uint)(auVar59._0_4_ + 0.1)),auVar58);
      auVar128._0_8_ = auVar153._0_8_;
      auVar128._8_8_ = auVar128._0_8_;
      auVar201._8_8_ = auVar163._0_8_;
      auVar201._0_8_ = auVar163._0_8_;
      auVar213._8_8_ = auVar68._0_8_;
      auVar213._0_8_ = auVar68._0_8_;
      auVar61 = vshufpd_avx(auVar163,auVar163,3);
      auVar59 = vshufpd_avx(auVar68,auVar68,3);
      auVar60 = vshufps_avx(auVar66,auVar67,0);
      auVar65 = vsubps_avx512vl(auVar120,auVar60);
      fVar198 = auVar60._0_4_;
      auVar156._0_4_ = fVar198 * auVar70._0_4_;
      fVar207 = auVar60._4_4_;
      auVar156._4_4_ = fVar207 * auVar70._4_4_;
      fVar208 = auVar60._8_4_;
      auVar156._8_4_ = fVar208 * auVar70._8_4_;
      fVar209 = auVar60._12_4_;
      auVar156._12_4_ = fVar209 * auVar70._12_4_;
      auVar164._0_4_ = fVar198 * auVar61._0_4_;
      auVar164._4_4_ = fVar207 * auVar61._4_4_;
      auVar164._8_4_ = fVar208 * auVar61._8_4_;
      auVar164._12_4_ = fVar209 * auVar61._12_4_;
      auVar235._0_4_ = auVar59._0_4_ * fVar198;
      auVar235._4_4_ = auVar59._4_4_ * fVar207;
      auVar235._8_4_ = auVar59._8_4_ * fVar208;
      auVar235._12_4_ = auVar59._12_4_ * fVar209;
      auVar147._0_4_ = fVar198 * auVar73._0_4_;
      auVar147._4_4_ = fVar207 * auVar73._4_4_;
      auVar147._8_4_ = fVar208 * auVar73._8_4_;
      auVar147._12_4_ = fVar209 * auVar73._12_4_;
      auVar70 = vfmadd231ps_fma(auVar156,auVar65,auVar128);
      auVar73 = vfmadd231ps_fma(auVar164,auVar65,auVar201);
      auVar64 = vfmadd231ps_fma(auVar235,auVar65,auVar213);
      auVar65 = vfmadd231ps_fma(auVar147,auVar65,ZEXT816(0));
      auVar59 = vsubss_avx512f(auVar58,auVar66);
      auVar61 = vmovshdup_avx(auVar49);
      auVar153 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar66._0_4_)),auVar49,auVar59);
      auVar59 = vsubss_avx512f(auVar58,auVar67);
      auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * auVar67._0_4_)),auVar49,auVar59);
      auVar68 = vdivss_avx512f(auVar58,ZEXT416((uint)fVar107));
      auVar49 = vsubps_avx(auVar73,auVar70);
      auVar160 = auVar241._0_16_;
      auVar59 = vmulps_avx512vl(auVar49,auVar160);
      auVar49 = vsubps_avx(auVar64,auVar73);
      auVar60 = vmulps_avx512vl(auVar49,auVar160);
      auVar49 = vsubps_avx(auVar65,auVar64);
      auVar49 = vmulps_avx512vl(auVar49,auVar160);
      auVar61 = vminps_avx(auVar60,auVar49);
      auVar49 = vmaxps_avx(auVar60,auVar49);
      auVar61 = vminps_avx(auVar59,auVar61);
      auVar49 = vmaxps_avx(auVar59,auVar49);
      auVar59 = vshufpd_avx(auVar61,auVar61,3);
      auVar60 = vshufpd_avx(auVar49,auVar49,3);
      auVar61 = vminps_avx(auVar61,auVar59);
      auVar49 = vmaxps_avx(auVar49,auVar60);
      fVar107 = auVar68._0_4_;
      auVar186._0_4_ = auVar61._0_4_ * fVar107;
      auVar186._4_4_ = auVar61._4_4_ * fVar107;
      auVar186._8_4_ = auVar61._8_4_ * fVar107;
      auVar186._12_4_ = auVar61._12_4_ * fVar107;
      auVar172._0_4_ = fVar107 * auVar49._0_4_;
      auVar172._4_4_ = fVar107 * auVar49._4_4_;
      auVar172._8_4_ = fVar107 * auVar49._8_4_;
      auVar172._12_4_ = fVar107 * auVar49._12_4_;
      auVar68 = vdivss_avx512f(auVar58,ZEXT416((uint)(auVar62._0_4_ - auVar153._0_4_)));
      auVar49 = vshufpd_avx(auVar70,auVar70,3);
      auVar61 = vshufpd_avx(auVar73,auVar73,3);
      auVar59 = vshufpd_avx(auVar64,auVar64,3);
      auVar60 = vshufpd_avx(auVar65,auVar65,3);
      auVar49 = vsubps_avx(auVar49,auVar70);
      auVar70 = vsubps_avx(auVar61,auVar73);
      auVar73 = vsubps_avx(auVar59,auVar64);
      auVar60 = vsubps_avx(auVar60,auVar65);
      auVar61 = vminps_avx(auVar49,auVar70);
      auVar49 = vmaxps_avx(auVar49,auVar70);
      auVar59 = vminps_avx(auVar73,auVar60);
      auVar59 = vminps_avx(auVar61,auVar59);
      auVar61 = vmaxps_avx(auVar73,auVar60);
      auVar49 = vmaxps_avx(auVar49,auVar61);
      fVar107 = auVar68._0_4_;
      auVar214._0_4_ = fVar107 * auVar59._0_4_;
      auVar214._4_4_ = fVar107 * auVar59._4_4_;
      auVar214._8_4_ = fVar107 * auVar59._8_4_;
      auVar214._12_4_ = fVar107 * auVar59._12_4_;
      auVar202._0_4_ = fVar107 * auVar49._0_4_;
      auVar202._4_4_ = fVar107 * auVar49._4_4_;
      auVar202._8_4_ = fVar107 * auVar49._8_4_;
      auVar202._12_4_ = fVar107 * auVar49._12_4_;
      auVar60 = vinsertps_avx(auVar56,auVar153,0x10);
      auVar63 = vpermt2ps_avx512vl(auVar56,_DAT_01fb9f90,auVar62);
      auVar119._0_4_ = auVar60._0_4_ + auVar63._0_4_;
      auVar119._4_4_ = auVar60._4_4_ + auVar63._4_4_;
      auVar119._8_4_ = auVar60._8_4_ + auVar63._8_4_;
      auVar119._12_4_ = auVar60._12_4_ + auVar63._12_4_;
      auVar20._8_4_ = 0x3f000000;
      auVar20._0_8_ = 0x3f0000003f000000;
      auVar20._12_4_ = 0x3f000000;
      auVar68 = vmulps_avx512vl(auVar119,auVar20);
      auVar61 = vshufps_avx(auVar68,auVar68,0x54);
      uVar115 = auVar68._0_4_;
      auVar122._4_4_ = uVar115;
      auVar122._0_4_ = uVar115;
      auVar122._8_4_ = uVar115;
      auVar122._12_4_ = uVar115;
      auVar59 = vfmadd213ps_fma(auVar48,auVar122,auVar55);
      auVar70 = vfmadd213ps_fma(auVar51,auVar122,auVar54);
      auVar73 = vfmadd213ps_fma(local_290,auVar122,auVar4);
      auVar49 = vsubps_avx(auVar70,auVar59);
      auVar59 = vfmadd213ps_fma(auVar49,auVar122,auVar59);
      auVar49 = vsubps_avx(auVar73,auVar70);
      auVar49 = vfmadd213ps_fma(auVar49,auVar122,auVar70);
      auVar49 = vsubps_avx(auVar49,auVar59);
      auVar59 = vfmadd231ps_fma(auVar59,auVar49,auVar122);
      auVar64 = vmulps_avx512vl(auVar49,auVar160);
      auVar225._8_8_ = auVar59._0_8_;
      auVar225._0_8_ = auVar59._0_8_;
      auVar49 = vshufpd_avx(auVar59,auVar59,3);
      auVar59 = vshufps_avx(auVar68,auVar68,0x55);
      auVar70 = vsubps_avx(auVar49,auVar225);
      auVar73 = vfmadd231ps_fma(auVar225,auVar59,auVar70);
      auVar236._8_8_ = auVar64._0_8_;
      auVar236._0_8_ = auVar64._0_8_;
      auVar49 = vshufpd_avx(auVar64,auVar64,3);
      auVar49 = vsubps_avx512vl(auVar49,auVar236);
      auVar49 = vfmadd213ps_avx512vl(auVar49,auVar59,auVar236);
      auVar123._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
      auVar123._8_4_ = auVar70._8_4_ ^ 0x80000000;
      auVar123._12_4_ = auVar70._12_4_ ^ 0x80000000;
      auVar59 = vmovshdup_avx512vl(auVar49);
      auVar237._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
      auVar237._8_4_ = auVar59._8_4_ ^ 0x80000000;
      auVar237._12_4_ = auVar59._12_4_ ^ 0x80000000;
      auVar64 = vmovshdup_avx512vl(auVar70);
      auVar65 = vpermt2ps_avx512vl(auVar237,ZEXT416(5),auVar70);
      auVar69 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar249 = ZEXT1664(auVar69);
      auVar59 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar59._0_4_ * auVar70._0_4_)),auVar49,auVar64);
      auVar70 = vpermt2ps_avx512vl(auVar49,SUB6416(ZEXT464(4),0),auVar123);
      auVar148._0_4_ = auVar59._0_4_;
      auVar148._4_4_ = auVar148._0_4_;
      auVar148._8_4_ = auVar148._0_4_;
      auVar148._12_4_ = auVar148._0_4_;
      auVar49 = vdivps_avx(auVar65,auVar148);
      auVar71 = vdivps_avx512vl(auVar70,auVar148);
      fVar107 = auVar73._0_4_;
      auVar59 = vshufps_avx(auVar73,auVar73,0x55);
      auVar226._0_4_ = fVar107 * auVar49._0_4_ + auVar59._0_4_ * auVar71._0_4_;
      auVar226._4_4_ = fVar107 * auVar49._4_4_ + auVar59._4_4_ * auVar71._4_4_;
      auVar226._8_4_ = fVar107 * auVar49._8_4_ + auVar59._8_4_ * auVar71._8_4_;
      auVar226._12_4_ = fVar107 * auVar49._12_4_ + auVar59._12_4_ * auVar71._12_4_;
      auVar66 = vsubps_avx(auVar61,auVar226);
      auVar59 = vmovshdup_avx(auVar49);
      auVar61 = vinsertps_avx(auVar186,auVar214,0x1c);
      auVar238._0_4_ = auVar59._0_4_ * auVar61._0_4_;
      auVar238._4_4_ = auVar59._4_4_ * auVar61._4_4_;
      auVar238._8_4_ = auVar59._8_4_ * auVar61._8_4_;
      auVar238._12_4_ = auVar59._12_4_ * auVar61._12_4_;
      auVar67 = vinsertps_avx512f(auVar172,auVar202,0x1c);
      auVar59 = vmulps_avx512vl(auVar59,auVar67);
      auVar65 = vminps_avx512vl(auVar238,auVar59);
      auVar73 = vmaxps_avx(auVar59,auVar238);
      auVar64 = vmovshdup_avx(auVar71);
      auVar59 = vinsertps_avx(auVar214,auVar186,0x4c);
      auVar215._0_4_ = auVar64._0_4_ * auVar59._0_4_;
      auVar215._4_4_ = auVar64._4_4_ * auVar59._4_4_;
      auVar215._8_4_ = auVar64._8_4_ * auVar59._8_4_;
      auVar215._12_4_ = auVar64._12_4_ * auVar59._12_4_;
      auVar70 = vinsertps_avx(auVar202,auVar172,0x4c);
      auVar203._0_4_ = auVar64._0_4_ * auVar70._0_4_;
      auVar203._4_4_ = auVar64._4_4_ * auVar70._4_4_;
      auVar203._8_4_ = auVar64._8_4_ * auVar70._8_4_;
      auVar203._12_4_ = auVar64._12_4_ * auVar70._12_4_;
      auVar64 = vminps_avx(auVar215,auVar203);
      auVar65 = vaddps_avx512vl(auVar65,auVar64);
      auVar64 = vmaxps_avx(auVar203,auVar215);
      auVar204._0_4_ = auVar73._0_4_ + auVar64._0_4_;
      auVar204._4_4_ = auVar73._4_4_ + auVar64._4_4_;
      auVar204._8_4_ = auVar73._8_4_ + auVar64._8_4_;
      auVar204._12_4_ = auVar73._12_4_ + auVar64._12_4_;
      auVar216._8_8_ = 0x3f80000000000000;
      auVar216._0_8_ = 0x3f80000000000000;
      auVar73 = vsubps_avx(auVar216,auVar204);
      auVar64 = vsubps_avx(auVar216,auVar65);
      auVar65 = vsubps_avx(auVar60,auVar68);
      auVar68 = vsubps_avx(auVar63,auVar68);
      fVar209 = auVar65._0_4_;
      auVar239._0_4_ = fVar209 * auVar73._0_4_;
      fVar220 = auVar65._4_4_;
      auVar239._4_4_ = fVar220 * auVar73._4_4_;
      fVar221 = auVar65._8_4_;
      auVar239._8_4_ = fVar221 * auVar73._8_4_;
      fVar222 = auVar65._12_4_;
      auVar239._12_4_ = fVar222 * auVar73._12_4_;
      auVar72 = vbroadcastss_avx512vl(auVar49);
      auVar61 = vmulps_avx512vl(auVar72,auVar61);
      auVar67 = vmulps_avx512vl(auVar72,auVar67);
      auVar72 = vminps_avx512vl(auVar61,auVar67);
      auVar67 = vmaxps_avx512vl(auVar67,auVar61);
      auVar61 = vbroadcastss_avx512vl(auVar71);
      auVar59 = vmulps_avx512vl(auVar61,auVar59);
      auVar61 = vmulps_avx512vl(auVar61,auVar70);
      auVar70 = vminps_avx512vl(auVar59,auVar61);
      auVar70 = vaddps_avx512vl(auVar72,auVar70);
      auVar65 = vmulps_avx512vl(auVar65,auVar64);
      fVar107 = auVar68._0_4_;
      auVar205._0_4_ = fVar107 * auVar73._0_4_;
      fVar198 = auVar68._4_4_;
      auVar205._4_4_ = fVar198 * auVar73._4_4_;
      fVar207 = auVar68._8_4_;
      auVar205._8_4_ = fVar207 * auVar73._8_4_;
      fVar208 = auVar68._12_4_;
      auVar205._12_4_ = fVar208 * auVar73._12_4_;
      auVar217._0_4_ = fVar107 * auVar64._0_4_;
      auVar217._4_4_ = fVar198 * auVar64._4_4_;
      auVar217._8_4_ = fVar207 * auVar64._8_4_;
      auVar217._12_4_ = fVar208 * auVar64._12_4_;
      auVar61 = vmaxps_avx(auVar61,auVar59);
      auVar173._0_4_ = auVar67._0_4_ + auVar61._0_4_;
      auVar173._4_4_ = auVar67._4_4_ + auVar61._4_4_;
      auVar173._8_4_ = auVar67._8_4_ + auVar61._8_4_;
      auVar173._12_4_ = auVar67._12_4_ + auVar61._12_4_;
      auVar187._8_8_ = 0x3f800000;
      auVar187._0_8_ = 0x3f800000;
      auVar61 = vsubps_avx(auVar187,auVar173);
      auVar59 = vsubps_avx512vl(auVar187,auVar70);
      auVar233._0_4_ = fVar209 * auVar61._0_4_;
      auVar233._4_4_ = fVar220 * auVar61._4_4_;
      auVar233._8_4_ = fVar221 * auVar61._8_4_;
      auVar233._12_4_ = fVar222 * auVar61._12_4_;
      auVar227._0_4_ = fVar209 * auVar59._0_4_;
      auVar227._4_4_ = fVar220 * auVar59._4_4_;
      auVar227._8_4_ = fVar221 * auVar59._8_4_;
      auVar227._12_4_ = fVar222 * auVar59._12_4_;
      auVar174._0_4_ = fVar107 * auVar61._0_4_;
      auVar174._4_4_ = fVar198 * auVar61._4_4_;
      auVar174._8_4_ = fVar207 * auVar61._8_4_;
      auVar174._12_4_ = fVar208 * auVar61._12_4_;
      auVar188._0_4_ = fVar107 * auVar59._0_4_;
      auVar188._4_4_ = fVar198 * auVar59._4_4_;
      auVar188._8_4_ = fVar207 * auVar59._8_4_;
      auVar188._12_4_ = fVar208 * auVar59._12_4_;
      auVar61 = vminps_avx(auVar233,auVar227);
      auVar59 = vminps_avx512vl(auVar174,auVar188);
      auVar70 = vminps_avx512vl(auVar61,auVar59);
      auVar61 = vmaxps_avx(auVar227,auVar233);
      auVar59 = vmaxps_avx(auVar188,auVar174);
      auVar59 = vmaxps_avx(auVar59,auVar61);
      auVar73 = vminps_avx512vl(auVar239,auVar65);
      auVar61 = vminps_avx(auVar205,auVar217);
      auVar61 = vminps_avx(auVar73,auVar61);
      auVar61 = vhaddps_avx(auVar70,auVar61);
      auVar73 = vmaxps_avx512vl(auVar65,auVar239);
      auVar70 = vmaxps_avx(auVar217,auVar205);
      auVar70 = vmaxps_avx(auVar70,auVar73);
      auVar59 = vhaddps_avx(auVar59,auVar70);
      auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
      auVar59 = vshufps_avx(auVar59,auVar59,0xe8);
      auVar175._0_4_ = auVar61._0_4_ + auVar66._0_4_;
      auVar175._4_4_ = auVar61._4_4_ + auVar66._4_4_;
      auVar175._8_4_ = auVar61._8_4_ + auVar66._8_4_;
      auVar175._12_4_ = auVar61._12_4_ + auVar66._12_4_;
      auVar189._0_4_ = auVar59._0_4_ + auVar66._0_4_;
      auVar189._4_4_ = auVar59._4_4_ + auVar66._4_4_;
      auVar189._8_4_ = auVar59._8_4_ + auVar66._8_4_;
      auVar189._12_4_ = auVar59._12_4_ + auVar66._12_4_;
      auVar61 = vmaxps_avx(auVar60,auVar175);
      auVar59 = vminps_avx(auVar189,auVar63);
      uVar43 = vcmpps_avx512vl(auVar59,auVar61,1);
    } while ((uVar43 & 3) != 0);
    uVar43 = vcmpps_avx512vl(auVar189,auVar63,1);
    uVar16 = vcmpps_avx512vl(auVar56,auVar175,1);
    if (((ushort)uVar16 & (ushort)uVar43 & 1) == 0) {
      bVar35 = 0;
    }
    else {
      auVar61 = vmovshdup_avx(auVar175);
      bVar35 = auVar153._0_4_ < auVar61._0_4_ & (byte)(uVar43 >> 1) & 0x7f;
    }
    if (((3 < (uint)uVar37 || uVar8 != 0 && !bVar46) | bVar35) == 1) {
      lVar39 = 0xc9;
      do {
        lVar39 = lVar39 + -1;
        if (lVar39 == 0) goto LAB_019c6b2e;
        auVar56 = vsubss_avx512f(auVar58,auVar66);
        fVar207 = auVar56._0_4_;
        fVar107 = fVar207 * fVar207 * fVar207;
        fVar208 = auVar66._0_4_;
        fVar198 = fVar208 * 3.0 * fVar207 * fVar207;
        fVar207 = fVar207 * fVar208 * fVar208 * 3.0;
        auVar136._4_4_ = fVar107;
        auVar136._0_4_ = fVar107;
        auVar136._8_4_ = fVar107;
        auVar136._12_4_ = fVar107;
        auVar129._4_4_ = fVar198;
        auVar129._0_4_ = fVar198;
        auVar129._8_4_ = fVar198;
        auVar129._12_4_ = fVar198;
        auVar109._4_4_ = fVar207;
        auVar109._0_4_ = fVar207;
        auVar109._8_4_ = fVar207;
        auVar109._12_4_ = fVar207;
        fVar208 = fVar208 * fVar208 * fVar208;
        auVar157._0_4_ = (float)local_2a0._0_4_ * fVar208;
        auVar157._4_4_ = (float)local_2a0._4_4_ * fVar208;
        auVar157._8_4_ = fStack_298 * fVar208;
        auVar157._12_4_ = fStack_294 * fVar208;
        auVar56 = vfmadd231ps_fma(auVar157,auVar4,auVar109);
        auVar56 = vfmadd231ps_fma(auVar56,auVar54,auVar129);
        auVar56 = vfmadd231ps_fma(auVar56,auVar55,auVar136);
        auVar110._8_8_ = auVar56._0_8_;
        auVar110._0_8_ = auVar56._0_8_;
        auVar56 = vshufpd_avx(auVar56,auVar56,3);
        auVar61 = vshufps_avx(auVar66,auVar66,0x55);
        auVar56 = vsubps_avx(auVar56,auVar110);
        auVar61 = vfmadd213ps_fma(auVar56,auVar61,auVar110);
        fVar107 = auVar61._0_4_;
        auVar56 = vshufps_avx(auVar61,auVar61,0x55);
        auVar111._0_4_ = auVar49._0_4_ * fVar107 + auVar71._0_4_ * auVar56._0_4_;
        auVar111._4_4_ = auVar49._4_4_ * fVar107 + auVar71._4_4_ * auVar56._4_4_;
        auVar111._8_4_ = auVar49._8_4_ * fVar107 + auVar71._8_4_ * auVar56._8_4_;
        auVar111._12_4_ = auVar49._12_4_ * fVar107 + auVar71._12_4_ * auVar56._12_4_;
        auVar66 = vsubps_avx(auVar66,auVar111);
        auVar56 = vandps_avx512vl(auVar61,auVar242._0_16_);
        auVar61 = vprolq_avx512vl(auVar56,0x20);
        auVar56 = vmaxss_avx(auVar61,auVar56);
        bVar46 = auVar56._0_4_ <= (float)local_2b0._0_4_;
      } while ((float)local_2b0._0_4_ <= auVar56._0_4_);
      auVar56 = vucomiss_avx512f(auVar69);
      if (bVar46) {
        auVar49 = vucomiss_avx512f(auVar56);
        auVar250 = ZEXT1664(auVar49);
        if (bVar46) {
          vmovshdup_avx(auVar56);
          auVar49 = vucomiss_avx512f(auVar69);
          if (bVar46) {
            auVar61 = vucomiss_avx512f(auVar49);
            auVar250 = ZEXT1664(auVar61);
            if (bVar46) {
              auVar58 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar68 = vinsertps_avx(auVar58,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar58 = vdpps_avx(auVar68,local_2c0,0x7f);
              auVar59 = vdpps_avx(auVar68,local_2d0,0x7f);
              auVar60 = vdpps_avx(auVar68,local_2e0,0x7f);
              auVar70 = vdpps_avx(auVar68,local_2f0,0x7f);
              auVar73 = vdpps_avx(auVar68,local_300,0x7f);
              auVar64 = vdpps_avx(auVar68,local_310,0x7f);
              auVar65 = vdpps_avx(auVar68,local_320,0x7f);
              auVar68 = vdpps_avx(auVar68,local_330,0x7f);
              auVar66 = vsubss_avx512f(auVar61,auVar49);
              fVar208 = auVar49._0_4_;
              auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar73._0_4_)),auVar66,auVar58);
              auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar64._0_4_ * fVar208)),auVar66,auVar59);
              auVar59 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * fVar208)),auVar66,auVar60);
              auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar68._0_4_)),auVar66,auVar70);
              auVar61 = vsubss_avx512f(auVar61,auVar56);
              auVar165._0_4_ = auVar61._0_4_;
              fVar107 = auVar165._0_4_ * auVar165._0_4_ * auVar165._0_4_;
              local_120 = auVar56._0_4_;
              fVar198 = local_120 * 3.0 * auVar165._0_4_ * auVar165._0_4_;
              fVar207 = auVar165._0_4_ * local_120 * local_120 * 3.0;
              fVar220 = local_120 * local_120 * local_120;
              auVar61 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar60._0_4_)),
                                        ZEXT416((uint)fVar207),auVar59);
              auVar61 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar198),auVar58);
              auVar49 = vfmadd231ss_fma(auVar61,ZEXT416((uint)fVar107),auVar49);
              fVar209 = auVar49._0_4_;
              if ((fVar1 <= fVar209) &&
                 (fVar221 = *(float *)(ray + k * 4 + 0x100), fVar209 <= fVar221)) {
                auVar49 = vshufps_avx(auVar56,auVar56,0x55);
                auVar58 = vsubps_avx512vl(auVar120,auVar49);
                fVar222 = auVar49._0_4_;
                auVar194._0_4_ = fVar222 * (float)local_350._0_4_;
                fVar223 = auVar49._4_4_;
                auVar194._4_4_ = fVar223 * (float)local_350._4_4_;
                fVar228 = auVar49._8_4_;
                auVar194._8_4_ = fVar228 * fStack_348;
                fVar229 = auVar49._12_4_;
                auVar194._12_4_ = fVar229 * fStack_344;
                auVar206._0_4_ = fVar222 * (float)local_3a0._0_4_;
                auVar206._4_4_ = fVar223 * (float)local_3a0._4_4_;
                auVar206._8_4_ = fVar228 * fStack_398;
                auVar206._12_4_ = fVar229 * fStack_394;
                auVar218._0_4_ = fVar222 * (float)local_3b0._0_4_;
                auVar218._4_4_ = fVar223 * (float)local_3b0._4_4_;
                auVar218._8_4_ = fVar228 * fStack_3a8;
                auVar218._12_4_ = fVar229 * fStack_3a4;
                auVar176._0_4_ = fVar222 * (float)local_370._0_4_;
                auVar176._4_4_ = fVar223 * (float)local_370._4_4_;
                auVar176._8_4_ = fVar228 * fStack_368;
                auVar176._12_4_ = fVar229 * fStack_364;
                auVar49 = vfmadd231ps_fma(auVar194,auVar58,local_340);
                auVar61 = vfmadd231ps_fma(auVar206,auVar58,local_380);
                auVar120 = vfmadd231ps_fma(auVar218,auVar58,local_390);
                auVar58 = vfmadd231ps_fma(auVar176,auVar58,local_360);
                auVar49 = vsubps_avx(auVar61,auVar49);
                auVar61 = vsubps_avx(auVar120,auVar61);
                auVar120 = vsubps_avx(auVar58,auVar120);
                auVar219._0_4_ = local_120 * auVar61._0_4_;
                auVar219._4_4_ = local_120 * auVar61._4_4_;
                auVar219._8_4_ = local_120 * auVar61._8_4_;
                auVar219._12_4_ = local_120 * auVar61._12_4_;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar49 = vfmadd231ps_fma(auVar219,auVar165,auVar49);
                auVar177._0_4_ = local_120 * auVar120._0_4_;
                auVar177._4_4_ = local_120 * auVar120._4_4_;
                auVar177._8_4_ = local_120 * auVar120._8_4_;
                auVar177._12_4_ = local_120 * auVar120._12_4_;
                auVar61 = vfmadd231ps_fma(auVar177,auVar165,auVar61);
                auVar178._0_4_ = local_120 * auVar61._0_4_;
                auVar178._4_4_ = local_120 * auVar61._4_4_;
                auVar178._8_4_ = local_120 * auVar61._8_4_;
                auVar178._12_4_ = local_120 * auVar61._12_4_;
                auVar49 = vfmadd231ps_fma(auVar178,auVar165,auVar49);
                auVar49 = vmulps_avx512vl(auVar49,auVar160);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar158._0_4_ = fVar220 * (float)local_3f0._0_4_;
                  auVar158._4_4_ = fVar220 * (float)local_3f0._4_4_;
                  auVar158._8_4_ = fVar220 * fStack_3e8;
                  auVar158._12_4_ = fVar220 * fStack_3e4;
                  auVar149._4_4_ = fVar207;
                  auVar149._0_4_ = fVar207;
                  auVar149._8_4_ = fVar207;
                  auVar149._12_4_ = fVar207;
                  auVar61 = vfmadd132ps_fma(auVar149,auVar158,local_3e0);
                  auVar137._4_4_ = fVar198;
                  auVar137._0_4_ = fVar198;
                  auVar137._8_4_ = fVar198;
                  auVar137._12_4_ = fVar198;
                  auVar61 = vfmadd132ps_fma(auVar137,auVar61,local_3d0);
                  auVar130._4_4_ = fVar107;
                  auVar130._0_4_ = fVar107;
                  auVar130._8_4_ = fVar107;
                  auVar130._12_4_ = fVar107;
                  auVar58 = vfmadd132ps_fma(auVar130,auVar61,local_3c0);
                  auVar61 = vshufps_avx(auVar58,auVar58,0xc9);
                  auVar120 = vshufps_avx(auVar49,auVar49,0xc9);
                  auVar131._0_4_ = auVar58._0_4_ * auVar120._0_4_;
                  auVar131._4_4_ = auVar58._4_4_ * auVar120._4_4_;
                  auVar131._8_4_ = auVar58._8_4_ * auVar120._8_4_;
                  auVar131._12_4_ = auVar58._12_4_ * auVar120._12_4_;
                  auVar49 = vfmsub231ps_fma(auVar131,auVar49,auVar61);
                  local_140 = auVar49._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar209;
                    uVar115 = vextractps_avx(auVar49,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar115;
                    uVar115 = vextractps_avx(auVar49,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar115;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                    *(float *)(ray + k * 4 + 0x1e0) = local_120;
                    *(float *)(ray + k * 4 + 0x200) = fVar208;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_019c6b2e;
                  }
                  auVar140._8_4_ = 1;
                  auVar140._0_8_ = 0x100000001;
                  auVar140._12_4_ = 1;
                  auVar140._16_4_ = 1;
                  auVar140._20_4_ = 1;
                  auVar140._24_4_ = 1;
                  auVar140._28_4_ = 1;
                  local_100 = vpermps_avx2(auVar140,ZEXT1632(auVar56));
                  auVar81 = vpermps_avx2(auVar140,ZEXT1632(auVar49));
                  local_160 = vpermps_avx512vl(auVar248._0_32_,ZEXT1632(auVar49));
                  local_180[0] = (RTCHitN)auVar81[0];
                  local_180[1] = (RTCHitN)auVar81[1];
                  local_180[2] = (RTCHitN)auVar81[2];
                  local_180[3] = (RTCHitN)auVar81[3];
                  local_180[4] = (RTCHitN)auVar81[4];
                  local_180[5] = (RTCHitN)auVar81[5];
                  local_180[6] = (RTCHitN)auVar81[6];
                  local_180[7] = (RTCHitN)auVar81[7];
                  local_180[8] = (RTCHitN)auVar81[8];
                  local_180[9] = (RTCHitN)auVar81[9];
                  local_180[10] = (RTCHitN)auVar81[10];
                  local_180[0xb] = (RTCHitN)auVar81[0xb];
                  local_180[0xc] = (RTCHitN)auVar81[0xc];
                  local_180[0xd] = (RTCHitN)auVar81[0xd];
                  local_180[0xe] = (RTCHitN)auVar81[0xe];
                  local_180[0xf] = (RTCHitN)auVar81[0xf];
                  local_180[0x10] = (RTCHitN)auVar81[0x10];
                  local_180[0x11] = (RTCHitN)auVar81[0x11];
                  local_180[0x12] = (RTCHitN)auVar81[0x12];
                  local_180[0x13] = (RTCHitN)auVar81[0x13];
                  local_180[0x14] = (RTCHitN)auVar81[0x14];
                  local_180[0x15] = (RTCHitN)auVar81[0x15];
                  local_180[0x16] = (RTCHitN)auVar81[0x16];
                  local_180[0x17] = (RTCHitN)auVar81[0x17];
                  local_180[0x18] = (RTCHitN)auVar81[0x18];
                  local_180[0x19] = (RTCHitN)auVar81[0x19];
                  local_180[0x1a] = (RTCHitN)auVar81[0x1a];
                  local_180[0x1b] = (RTCHitN)auVar81[0x1b];
                  local_180[0x1c] = (RTCHitN)auVar81[0x1c];
                  local_180[0x1d] = (RTCHitN)auVar81[0x1d];
                  local_180[0x1e] = (RTCHitN)auVar81[0x1e];
                  local_180[0x1f] = (RTCHitN)auVar81[0x1f];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  fStack_11c = local_120;
                  fStack_118 = local_120;
                  fStack_114 = local_120;
                  fStack_110 = local_120;
                  fStack_10c = local_120;
                  fStack_108 = local_120;
                  fStack_104 = local_120;
                  local_e0 = local_200._0_8_;
                  uStack_d8 = local_200._8_8_;
                  uStack_d0 = local_200._16_8_;
                  uStack_c8 = local_200._24_8_;
                  local_c0 = local_1e0;
                  vpcmpeqd_avx2(local_1e0,local_1e0);
                  uStack_9c = context->user->instID[0];
                  local_a0 = uStack_9c;
                  uStack_98 = uStack_9c;
                  uStack_94 = uStack_9c;
                  uStack_90 = uStack_9c;
                  uStack_8c = uStack_9c;
                  uStack_88 = uStack_9c;
                  uStack_84 = uStack_9c;
                  uStack_7c = context->user->instPrimID[0];
                  local_80 = uStack_7c;
                  uStack_78 = uStack_7c;
                  uStack_74 = uStack_7c;
                  uStack_70 = uStack_7c;
                  uStack_6c = uStack_7c;
                  uStack_68 = uStack_7c;
                  uStack_64 = uStack_7c;
                  *(float *)(ray + k * 4 + 0x100) = fVar209;
                  local_420 = local_220;
                  local_460.valid = (int *)local_420;
                  local_460.geometryUserPtr = pGVar9->userPtr;
                  local_460.context = context->user;
                  local_460.hit = local_180;
                  local_460.N = 8;
                  local_460.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&local_460);
                    auVar56 = vxorps_avx512vl(auVar69,auVar69);
                    auVar249 = ZEXT1664(auVar56);
                    auVar250 = ZEXT464(0x3f800000);
                    auVar247 = ZEXT3264(_DAT_01fb9fe0);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar246 = ZEXT1664(auVar56);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar245 = ZEXT1664(auVar56);
                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar244 = ZEXT3264(auVar81);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar243 = ZEXT1664(auVar56);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar242 = ZEXT1664(auVar56);
                    auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar241 = ZEXT1664(auVar56);
                    auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar248 = ZEXT3264(auVar81);
                  }
                  auVar56 = auVar249._0_16_;
                  if (local_420 != (undefined1  [32])0x0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_460);
                      auVar56 = vxorps_avx512vl(auVar56,auVar56);
                      auVar249 = ZEXT1664(auVar56);
                      auVar250 = ZEXT464(0x3f800000);
                      auVar247 = ZEXT3264(_DAT_01fb9fe0);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar246 = ZEXT1664(auVar56);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar245 = ZEXT1664(auVar56);
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar244 = ZEXT3264(auVar81);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar243 = ZEXT1664(auVar56);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar242 = ZEXT1664(auVar56);
                      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar241 = ZEXT1664(auVar56);
                      auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar248 = ZEXT3264(auVar81);
                    }
                    if (local_420 != (undefined1  [32])0x0) {
                      uVar43 = vptestmd_avx512vl(local_420,local_420);
                      iVar28 = *(int *)(local_460.hit + 4);
                      iVar29 = *(int *)(local_460.hit + 8);
                      iVar30 = *(int *)(local_460.hit + 0xc);
                      iVar31 = *(int *)(local_460.hit + 0x10);
                      iVar32 = *(int *)(local_460.hit + 0x14);
                      iVar33 = *(int *)(local_460.hit + 0x18);
                      iVar34 = *(int *)(local_460.hit + 0x1c);
                      bVar35 = (byte)uVar43;
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x180) =
                           (uint)(bVar35 & 1) * *(int *)local_460.hit |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x180);
                      *(uint *)(local_460.ray + 0x184) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x184);
                      *(uint *)(local_460.ray + 0x188) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x188);
                      *(uint *)(local_460.ray + 0x18c) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x18c);
                      *(uint *)(local_460.ray + 400) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 400);
                      *(uint *)(local_460.ray + 0x194) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x194);
                      *(uint *)(local_460.ray + 0x198) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x198);
                      *(uint *)(local_460.ray + 0x19c) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x19c);
                      iVar28 = *(int *)(local_460.hit + 0x24);
                      iVar29 = *(int *)(local_460.hit + 0x28);
                      iVar30 = *(int *)(local_460.hit + 0x2c);
                      iVar31 = *(int *)(local_460.hit + 0x30);
                      iVar32 = *(int *)(local_460.hit + 0x34);
                      iVar33 = *(int *)(local_460.hit + 0x38);
                      iVar34 = *(int *)(local_460.hit + 0x3c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x1a0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x20) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1a0);
                      *(uint *)(local_460.ray + 0x1a4) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1a4);
                      *(uint *)(local_460.ray + 0x1a8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1a8);
                      *(uint *)(local_460.ray + 0x1ac) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1ac);
                      *(uint *)(local_460.ray + 0x1b0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1b0);
                      *(uint *)(local_460.ray + 0x1b4) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1b4);
                      *(uint *)(local_460.ray + 0x1b8) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1b8);
                      *(uint *)(local_460.ray + 0x1bc) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1bc);
                      iVar28 = *(int *)(local_460.hit + 0x44);
                      iVar29 = *(int *)(local_460.hit + 0x48);
                      iVar30 = *(int *)(local_460.hit + 0x4c);
                      iVar31 = *(int *)(local_460.hit + 0x50);
                      iVar32 = *(int *)(local_460.hit + 0x54);
                      iVar33 = *(int *)(local_460.hit + 0x58);
                      iVar34 = *(int *)(local_460.hit + 0x5c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x1c0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x40) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1c0);
                      *(uint *)(local_460.ray + 0x1c4) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1c4);
                      *(uint *)(local_460.ray + 0x1c8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1c8);
                      *(uint *)(local_460.ray + 0x1cc) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1cc);
                      *(uint *)(local_460.ray + 0x1d0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1d0);
                      *(uint *)(local_460.ray + 0x1d4) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x1d4);
                      *(uint *)(local_460.ray + 0x1d8) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1d8);
                      *(uint *)(local_460.ray + 0x1dc) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1dc);
                      iVar28 = *(int *)(local_460.hit + 100);
                      iVar29 = *(int *)(local_460.hit + 0x68);
                      iVar30 = *(int *)(local_460.hit + 0x6c);
                      iVar31 = *(int *)(local_460.hit + 0x70);
                      iVar32 = *(int *)(local_460.hit + 0x74);
                      iVar33 = *(int *)(local_460.hit + 0x78);
                      iVar34 = *(int *)(local_460.hit + 0x7c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x1e0) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x60) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x1e0);
                      *(uint *)(local_460.ray + 0x1e4) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x1e4);
                      *(uint *)(local_460.ray + 0x1e8) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x1e8);
                      *(uint *)(local_460.ray + 0x1ec) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x1ec);
                      *(uint *)(local_460.ray + 0x1f0) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x1f0);
                      *(uint *)(local_460.ray + 500) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 500);
                      *(uint *)(local_460.ray + 0x1f8) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x1f8);
                      *(uint *)(local_460.ray + 0x1fc) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x1fc);
                      iVar28 = *(int *)(local_460.hit + 0x84);
                      iVar29 = *(int *)(local_460.hit + 0x88);
                      iVar30 = *(int *)(local_460.hit + 0x8c);
                      iVar31 = *(int *)(local_460.hit + 0x90);
                      iVar32 = *(int *)(local_460.hit + 0x94);
                      iVar33 = *(int *)(local_460.hit + 0x98);
                      iVar34 = *(int *)(local_460.hit + 0x9c);
                      bVar46 = (bool)((byte)(uVar43 >> 1) & 1);
                      bVar47 = (bool)((byte)(uVar43 >> 2) & 1);
                      bVar44 = (bool)((byte)(uVar43 >> 3) & 1);
                      bVar45 = (bool)((byte)(uVar43 >> 4) & 1);
                      bVar13 = (bool)((byte)(uVar43 >> 5) & 1);
                      bVar14 = (bool)((byte)(uVar43 >> 6) & 1);
                      bVar15 = SUB81(uVar43 >> 7,0);
                      *(uint *)(local_460.ray + 0x200) =
                           (uint)(bVar35 & 1) * *(int *)(local_460.hit + 0x80) |
                           (uint)!(bool)(bVar35 & 1) * *(int *)(local_460.ray + 0x200);
                      *(uint *)(local_460.ray + 0x204) =
                           (uint)bVar46 * iVar28 | (uint)!bVar46 * *(int *)(local_460.ray + 0x204);
                      *(uint *)(local_460.ray + 0x208) =
                           (uint)bVar47 * iVar29 | (uint)!bVar47 * *(int *)(local_460.ray + 0x208);
                      *(uint *)(local_460.ray + 0x20c) =
                           (uint)bVar44 * iVar30 | (uint)!bVar44 * *(int *)(local_460.ray + 0x20c);
                      *(uint *)(local_460.ray + 0x210) =
                           (uint)bVar45 * iVar31 | (uint)!bVar45 * *(int *)(local_460.ray + 0x210);
                      *(uint *)(local_460.ray + 0x214) =
                           (uint)bVar13 * iVar32 | (uint)!bVar13 * *(int *)(local_460.ray + 0x214);
                      *(uint *)(local_460.ray + 0x218) =
                           (uint)bVar14 * iVar33 | (uint)!bVar14 * *(int *)(local_460.ray + 0x218);
                      *(uint *)(local_460.ray + 0x21c) =
                           (uint)bVar15 * iVar34 | (uint)!bVar15 * *(int *)(local_460.ray + 0x21c);
                      auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xa0));
                      *(undefined1 (*) [32])(local_460.ray + 0x220) = auVar81;
                      auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xc0));
                      *(undefined1 (*) [32])(local_460.ray + 0x240) = auVar81;
                      auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0xe0));
                      *(undefined1 (*) [32])(local_460.ray + 0x260) = auVar81;
                      auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_460.hit + 0x100));
                      *(undefined1 (*) [32])(local_460.ray + 0x280) = auVar81;
                      goto LAB_019c6b2e;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar221;
                }
              }
            }
          }
        }
      }
      goto LAB_019c6b2e;
    }
    auVar49 = vinsertps_avx(auVar153,auVar62,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }